

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  stbtt__point sVar5;
  stbtt__point sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  stbtt_uint8 sVar10;
  byte bVar11;
  ImWchar IVar12;
  short sVar13;
  int iVar14;
  ImFont *pIVar15;
  ImFont **ppIVar16;
  stbtt_uint8 *data;
  ImFontConfig *pIVar17;
  long lVar18;
  char cVar19;
  char cVar25;
  stbrp_node *psVar33;
  undefined1 auVar34 [16];
  stbtt__buf fontdict;
  undefined1 auVar35 [14];
  undefined1 auVar36 [12];
  unkuint10 Var37;
  undefined1 auVar38 [12];
  undefined1 auVar39 [16];
  unkbyte10 Var40;
  undefined1 auVar41 [13];
  undefined1 auVar42 [11];
  undefined1 auVar43 [14];
  undefined1 auVar44 [15];
  undefined1 auVar45 [14];
  undefined1 auVar46 [16];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  uint6 uVar52;
  bool bVar53;
  ushort uVar54;
  short sVar55;
  stbtt_uint32 sVar56;
  stbtt_uint32 sVar57;
  stbtt_uint32 sVar58;
  stbtt_uint32 sVar59;
  stbtt_uint32 sVar60;
  stbtt_uint32 sVar61;
  uint uVar62;
  int iVar63;
  void *pvVar64;
  ulong uVar65;
  undefined4 extraout_var;
  int *piVar66;
  void *pvVar67;
  stbrp_context *ptr;
  uchar *puVar68;
  stbtt__point *points;
  stbtt__edge *psVar69;
  stbtt__buf *scanline;
  stbtt__active_edge *psVar70;
  stbtt__buf *psVar71;
  undefined8 *puVar72;
  int iVar73;
  long lVar74;
  ImWchar *pIVar75;
  ushort *puVar76;
  uint *puVar77;
  stbtt__active_edge *psVar78;
  stbtt__active_edge *psVar79;
  long lVar80;
  ulong uVar81;
  uint uVar82;
  stbtt_fontinfo *psVar83;
  ImFontAtlas *pIVar84;
  byte *pbVar85;
  ImFontAtlas *atlas;
  uchar uVar86;
  ulong uVar87;
  stbtt__edge *psVar88;
  ulong uVar89;
  size_t size;
  byte *pbVar90;
  ImFontConfig *pIVar91;
  int iVar92;
  int iVar93;
  long lVar94;
  undefined1 auVar95 [8];
  undefined8 *ptr_00;
  int iVar96;
  stbtt__active_edge *psVar97;
  uint uVar98;
  long lVar99;
  bool bVar100;
  byte bVar101;
  float fVar102;
  byte bVar109;
  char cVar110;
  char cVar111;
  short sVar112;
  ushort uVar113;
  short sVar114;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar115;
  undefined4 uVar123;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  uint uVar124;
  undefined1 auVar119 [16];
  uint uVar125;
  uint uVar127;
  uint uVar128;
  uint uVar129;
  undefined1 auVar126 [16];
  uint uVar130;
  uint uVar131;
  uint uVar132;
  undefined1 in_XMM3 [16];
  uint uVar133;
  uint uVar134;
  uint uVar136;
  uint uVar137;
  undefined1 auVar135 [16];
  uint uVar138;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar144;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar150;
  undefined4 uVar151;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar156 [16];
  float fVar161;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined4 uVar169;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  stbtt__buf sVar184;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb3c;
  int iVar185;
  undefined1 auStack_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined4 in_stack_fffffffffffffb60;
  uint in_stack_fffffffffffffb64;
  void *pvStack_490;
  undefined1 auStack_488 [16];
  undefined1 auStack_478 [16];
  ulong uStack_468;
  long lStack_460;
  undefined1 auStack_458 [16];
  undefined1 auStack_448 [16];
  undefined8 uStack_438;
  void *pvStack_430;
  undefined8 uStack_428;
  void *pvStack_420;
  stbrp_node *psStack_418;
  undefined8 uStack_410;
  int iStack_404;
  float fStack_400;
  uint uStack_3fc;
  void *pvStack_3f8;
  ulong uStack_3f0;
  undefined1 auStack_3e8 [16];
  ulong uStack_3d8;
  float fStack_3d0;
  int iStack_3cc;
  ulong uStack_3c8;
  uchar *puStack_3c0;
  long lStack_3b8;
  stbtt__point *psStack_3b0;
  uchar *puStack_3a8;
  ulong uStack_3a0;
  ulong uStack_398;
  float *pfStack_390;
  uint uStack_384;
  uint uStack_380;
  int iStack_37c;
  int iStack_378;
  float fStack_374;
  float fStack_370;
  int iStack_36c;
  int iStack_368;
  int iStack_364;
  stbrp_context *psStack_360;
  ulong uStack_358;
  stbtt_fontinfo *psStack_350;
  float *pfStack_348;
  ulong uStack_340;
  ulong uStack_338;
  stbtt__edge *psStack_330;
  float fStack_328;
  undefined4 uStack_324;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  float fStack_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  ImFontConfig *pIStack_308;
  long lStack_300;
  long lStack_2f8;
  undefined4 *puStack_2f0;
  long lStack_2e8;
  long lStack_2e0;
  size_t sStack_2d8;
  size_t sStack_2d0;
  undefined8 *puStack_2c8;
  int iStack_2c0;
  int iStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  ulong uStack_298;
  undefined8 uStack_290;
  stbtt__buf asStack_288 [33];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 auStack_68 [16];
  undefined1 auStack_58 [16];
  undefined1 auStack_48 [24];
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined6 uVar152;
  undefined8 uVar153;
  undefined1 auVar154 [12];
  undefined1 auVar155 [14];
  undefined1 auVar157 [16];
  undefined6 uVar170;
  undefined8 uVar171;
  undefined1 auVar172 [12];
  undefined1 auVar173 [14];
  undefined1 auVar177 [16];
  
  if (this->FontBuilderIO != (ImFontBuilderIO *)0x0) {
    bVar53 = (*this->FontBuilderIO->FontBuilder_Build)(this);
    return bVar53;
  }
  ImFontAtlasGetBuilderForStbTruetype::io.FontBuilder_Build = ImFontAtlasBuildWithStbTruetype;
  ImFontAtlasBuildInit(this);
  this->TexID = (ImTextureID)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  (this->TexUvScale).x = 0.0;
  (this->TexUvScale).y = 0.0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  pvStack_490 = (void *)0x0;
  uStack_438 = 0;
  pvStack_430 = (void *)0x0;
  iVar14 = (this->ConfigData).Size;
  if (0 < iVar14) {
    iVar63 = 8;
    if (7 < iVar14) {
      iVar63 = iVar14;
    }
    if (0 < iVar63) {
      pvStack_490 = ImGui::MemAlloc((long)iVar63 * 0x110);
    }
  }
  uVar62 = (this->Fonts).Size;
  if (uStack_438._4_4_ < (int)uVar62) {
    if (uStack_438._4_4_ == 0) {
      uVar98 = 8;
    }
    else {
      uVar98 = uStack_438._4_4_ / 2 + uStack_438._4_4_;
    }
    if ((int)uVar98 <= (int)uVar62) {
      uVar98 = uVar62;
    }
    if (uStack_438._4_4_ < (int)uVar98) {
      pvVar64 = ImGui::MemAlloc((long)(int)uVar98 << 5);
      if (pvStack_430 != (void *)0x0) {
        memcpy(pvVar64,pvStack_430,(long)(int)uStack_438 << 5);
        ImGui::MemFree(pvStack_430);
      }
      uStack_438 = (ulong)uVar98 << 0x20;
      pvStack_430 = pvVar64;
    }
  }
  uStack_438 = CONCAT44(uStack_438._4_4_,uVar62);
  pIVar84 = this;
  memset(pvStack_490,0,(long)iVar14 * 0x110);
  memset(pvStack_430,0,(long)(int)uStack_438 << 5);
  iVar63 = (this->ConfigData).Size;
  iVar185 = CONCAT13(iVar63 < 1,(int3)in_stack_fffffffffffffb3c);
  if (0 < iVar63) {
    lVar94 = 0;
    do {
      pIVar91 = (this->ConfigData).Data + lVar94;
      lVar74 = lVar94 * 0x110;
      *(undefined4 *)((long)pvStack_490 + lVar74 + 0xe0) = 0xffffffff;
      uVar65 = (ulong)(this->Fonts).Size;
      if ((long)uVar65 < 1) goto LAB_0013a313;
      pIVar15 = pIVar91->DstFont;
      ppIVar16 = (this->Fonts).Data;
      uVar89 = 0xffffffff;
      uVar87 = 0;
      do {
        if (pIVar15 == ppIVar16[uVar87]) {
          *(int *)((long)pvStack_490 + lVar74 + 0xe0) = (int)uVar87;
          uVar89 = uVar87 & 0xffffffff;
        }
        uVar87 = uVar87 + 1;
      } while ((uVar87 < uVar65) && ((int)uVar89 == -1));
      if ((int)uVar89 == -1) goto LAB_0013a313;
      auStack_458._0_8_ = lVar94;
      data = (stbtt_uint8 *)pIVar91->FontData;
      iVar63 = pIVar91->FontNo;
      sVar10 = *data;
      auStack_3e8._0_8_ = pIVar91;
      if (((((sVar10 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
         (((sVar10 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_0013724f:
        uVar62 = -(uint)(iVar63 != 0);
LAB_00137258:
        auStack_4b8._0_4_ = uVar62;
      }
      else {
        if (sVar10 == '\0') {
          if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_00137225;
          goto LAB_0013724f;
        }
        if ((((sVar10 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
        goto LAB_0013724f;
LAB_00137225:
        auStack_4b8._0_4_ = 0xffffffff;
        if (sVar10 == 't') {
          if (data[1] != 't') {
            if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_0013724f;
            goto LAB_0013729a;
          }
          if ((data[2] != 'c') || (data[3] != 'f')) goto LAB_0013729a;
          uVar62 = *(uint *)(data + 4);
          uVar62 = uVar62 >> 0x18 | (uVar62 & 0xff0000) >> 8 | (uVar62 & 0xff00) << 8 |
                   uVar62 << 0x18;
          if (((uVar62 != 0x20000) && (uVar62 != 0x10000)) ||
             (uVar62 = *(uint *)(data + 8),
             (int)(uVar62 >> 0x18 | (uVar62 & 0xff0000) >> 8 | (uVar62 & 0xff00) << 8 |
                  uVar62 << 0x18) <= iVar63)) goto LAB_0013729a;
          uVar62 = *(uint *)(data + (long)iVar63 * 4 + 0xc);
          uVar62 = uVar62 >> 0x18 | (uVar62 & 0xff0000) >> 8 | (uVar62 & 0xff00) << 8 |
                   uVar62 << 0x18;
          goto LAB_00137258;
        }
      }
LAB_0013729a:
      *(stbtt_uint8 **)((long)pvStack_490 + lVar74 + 8) = data;
      *(undefined4 *)((long)pvStack_490 + lVar74 + 0x10) = auStack_4b8._0_4_;
      *(undefined8 *)((long)pvStack_490 + lVar74 + 0x40) = 0;
      *(undefined8 *)((long)pvStack_490 + lVar74 + 0x48) = 0;
      sVar56 = stbtt__find_table(data,auStack_4b8._0_4_,"cmap");
      auVar116 = auStack_478;
      auStack_478._4_4_ = extraout_var;
      auStack_478._0_4_ = sVar56;
      auStack_478._8_8_ = auVar116._8_8_;
      sVar56 = stbtt__find_table(data,auStack_4b8._0_4_,"loca");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar74 + 0x18) = sVar56;
      sVar57 = stbtt__find_table(data,auStack_4b8._0_4_,"head");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar74 + 0x1c) = sVar57;
      sVar58 = stbtt__find_table(data,auStack_4b8._0_4_,"glyf");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar74 + 0x20) = sVar58;
      sVar59 = stbtt__find_table(data,auStack_4b8._0_4_,"hhea");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar74 + 0x24) = sVar59;
      sVar60 = stbtt__find_table(data,auStack_4b8._0_4_,"hmtx");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar74 + 0x28) = sVar60;
      sVar61 = stbtt__find_table(data,auStack_4b8._0_4_,"kern");
      auVar116 = auStack_478;
      *(stbtt_uint32 *)((long)pvStack_490 + lVar74 + 0x2c) = sVar61;
      uVar153 = auStack_478._0_8_;
      sVar61 = stbtt__find_table(data,auStack_4b8._0_4_,"GPOS");
      *(stbtt_uint32 *)((long)pvStack_490 + lVar74 + 0x30) = sVar61;
      iVar63 = auVar116._0_4_;
      if ((((iVar63 == 0) || (sVar57 == 0)) || (sVar59 == 0)) || (sVar60 == 0)) goto LAB_0013a313;
      if (sVar58 == 0) {
        uStack_428 = CONCAT44(uStack_428._4_4_,2);
        auStack_488._0_8_ = auStack_488._0_8_ & 0xffffffff00000000;
        uStack_410._0_4_ = 0;
        uVar62 = 0;
        sVar58 = stbtt__find_table(data,auStack_4b8._0_4_,"CFF ");
        if (sVar58 == 0) goto LAB_0013a313;
        *(undefined8 *)((long)pvStack_490 + lVar74 + 0x90) = 0;
        *(undefined8 *)((long)pvStack_490 + lVar74 + 0x98) = 0;
        *(undefined8 *)((long)pvStack_490 + lVar74 + 0x80) = 0;
        *(undefined8 *)((long)pvStack_490 + lVar74 + 0x88) = 0;
        *(stbtt_uint8 **)((long)pvStack_490 + lVar74 + 0x40) = data + sVar58;
        *(undefined8 *)((long)pvStack_490 + lVar74 + 0x48) = 0x2000000000000000;
        asStack_288[0].data = *(uchar **)((long)pvStack_490 + lVar74 + 0x40);
        uVar171 = *(undefined8 *)((long)pvStack_490 + lVar74 + 0x48);
        asStack_288[0].cursor = (int)uVar171;
        asStack_288[0].size = (int)((ulong)uVar171 >> 0x20);
        uVar98 = asStack_288[0].cursor + 2U;
        if (asStack_288[0].size < (int)(asStack_288[0].cursor + 2U)) {
          uVar98 = asStack_288[0].size;
        }
        if (asStack_288[0].cursor < -2) {
          uVar98 = asStack_288[0].size;
        }
        asStack_288[0].cursor = 0;
        if ((int)uVar98 < asStack_288[0].size) {
          asStack_288[0].cursor = (int)asStack_288[0].data[(int)uVar98];
        }
        if (asStack_288[0].size < asStack_288[0].cursor) {
          asStack_288[0].cursor = asStack_288[0].size;
        }
        stbtt__cff_get_index(asStack_288);
        sVar184 = stbtt__cff_get_index(asStack_288);
        auStack_448 = (undefined1  [16])stbtt__cff_index_get(sVar184,0);
        stbtt__cff_get_index(asStack_288);
        sVar184 = stbtt__cff_get_index(asStack_288);
        *(stbtt__buf *)((long)pvStack_490 + lVar74 + 0x60) = sVar184;
        stbtt__dict_get_ints((stbtt__buf *)auStack_448,0x11,1,(stbtt_uint32 *)auStack_488);
        stbtt__dict_get_ints((stbtt__buf *)auStack_448,0x106,1,(stbtt_uint32 *)&uStack_428);
        stbtt__dict_get_ints((stbtt__buf *)auStack_448,0x124,1,(stbtt_uint32 *)&uStack_410);
        stbtt__dict_get_ints
                  ((stbtt__buf *)auStack_448,0x125,1,(stbtt_uint32 *)&stack0xfffffffffffffb64);
        sVar184.data._4_4_ = sVar56;
        sVar184.data._0_4_ = in_stack_fffffffffffffb30;
        sVar184.cursor = sVar57;
        sVar184.size = iVar185;
        fontdict.cursor = in_stack_fffffffffffffb60;
        fontdict.data = &pIVar84->Locked;
        fontdict.size = uVar62;
        sVar184 = stbtt__get_subrs(sVar184,fontdict);
        *(stbtt__buf *)((long)pvStack_490 + lVar74 + 0x70) = sVar184;
        if (((stbtt_uint32)uStack_428 != 2) || (uVar151 = auStack_488._0_4_, auStack_488._0_4_ == 0)
           ) goto LAB_0013a313;
        in_stack_fffffffffffffb64 = uVar62;
        if ((stbtt_uint32)uStack_410 != 0) {
          if ((ulong)uVar62 == 0) goto LAB_0013a313;
          asStack_288[0].cursor = (stbtt_uint32)uStack_410;
          if (asStack_288[0].size < (int)(stbtt_uint32)uStack_410) {
            asStack_288[0].cursor = asStack_288[0].size;
          }
          if ((int)(stbtt_uint32)uStack_410 < 0) {
            asStack_288[0].cursor = asStack_288[0].size;
          }
          sVar184 = stbtt__cff_get_index(asStack_288);
          *(stbtt__buf *)((long)pvStack_490 + lVar74 + 0x80) = sVar184;
          puVar68 = asStack_288[0].data + uVar62;
          lVar94 = (ulong)(asStack_288[0].size - uVar62) << 0x20;
          if ((int)(asStack_288[0].size - uVar62 | uVar62) < 0 || asStack_288[0].size < (int)uVar62)
          {
            puVar68 = (uchar *)0x0;
            lVar94 = 0;
          }
          *(uchar **)((long)pvStack_490 + lVar74 + 0x90) = puVar68;
          *(long *)((long)pvStack_490 + lVar74 + 0x98) = lVar94;
        }
        asStack_288[0].cursor = uVar151;
        if (asStack_288[0].size < (int)uVar151) {
          asStack_288[0].cursor = asStack_288[0].size;
        }
        if ((int)uVar151 < 0) {
          asStack_288[0].cursor = asStack_288[0].size;
        }
        sVar184 = stbtt__cff_get_index(asStack_288);
        *(stbtt__buf *)((long)pvStack_490 + lVar74 + 0x50) = sVar184;
        this = pIVar84;
      }
      else {
        this = pIVar84;
        if (sVar56 == 0) goto LAB_0013a313;
      }
      sVar56 = stbtt__find_table(data,auStack_4b8._0_4_,"maxp");
      if (sVar56 == 0) {
        uVar62 = 0xffff;
      }
      else {
        uVar62 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar56 + 4) << 8 |
                               *(ushort *)(data + (ulong)sVar56 + 4) >> 8);
      }
      *(uint *)((long)pvStack_490 + lVar74 + 0x14) = uVar62;
      uVar54 = *(ushort *)(data + (uVar153 & 0xffffffff) + 2) << 8 |
               *(ushort *)(data + (uVar153 & 0xffffffff) + 2) >> 8;
      *(undefined4 *)((long)pvStack_490 + lVar74 + 0x34) = 0;
      if (uVar54 != 0) {
        uVar62 = iVar63 + 4;
        uVar65 = (ulong)uVar54;
        do {
          uVar54 = *(ushort *)(data + uVar62) << 8 | *(ushort *)(data + uVar62) >> 8;
          if ((uVar54 == 0) ||
             ((uVar54 == 3 &&
              ((uVar54 = *(ushort *)(data + (ulong)uVar62 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar62 + 2) >> 8, uVar54 == 10 || (uVar54 == 1)))
              ))) {
            uVar98 = *(uint *)(data + (ulong)uVar62 + 4);
            *(uint *)((long)pvStack_490 + lVar74 + 0x34) =
                 (uVar98 >> 0x18 | (uVar98 & 0xff0000) >> 8 | (uVar98 & 0xff00) << 8 |
                 uVar98 << 0x18) + iVar63;
          }
          uVar62 = uVar62 + 8;
          uVar65 = uVar65 - 1;
        } while (uVar65 != 0);
      }
      if (*(int *)((long)pvStack_490 + lVar74 + 0x34) == 0) goto LAB_0013a313;
      *(uint *)((long)pvStack_490 + lVar74 + 0x38) =
           (uint)(ushort)(*(ushort *)(data + (long)(int)sVar57 + 0x32) << 8 |
                         *(ushort *)(data + (long)(int)sVar57 + 0x32) >> 8);
      piVar66 = (int *)((long)*(int *)((long)pvStack_490 + lVar74 + 0xe0) * 0x20 + (long)pvStack_430
                       );
      pIVar75 = *(ImWchar **)(auStack_3e8._0_8_ + 0x38);
      if (pIVar75 == (ImWchar *)0x0) {
        pIVar75 = GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvStack_490 + lVar74 + 0xd8) = pIVar75;
      IVar12 = *pIVar75;
      while (IVar12 != 0) {
        uVar54 = pIVar75[1];
        if (uVar54 == 0) break;
        uVar62 = *(uint *)((long)pvStack_490 + lVar74 + 0xe4);
        uVar98 = (uint)uVar54;
        if ((int)(uint)uVar54 < (int)uVar62) {
          uVar98 = uVar62;
        }
        *(uint *)((long)pvStack_490 + lVar74 + 0xe4) = uVar98;
        IVar12 = pIVar75[2];
        pIVar75 = pIVar75 + 2;
      }
      *piVar66 = *piVar66 + 1;
      iVar63 = *(int *)((long)pvStack_490 + lVar74 + 0xe4);
      if (iVar63 < piVar66[1]) {
        iVar63 = piVar66[1];
      }
      piVar66[1] = iVar63;
      lVar94 = auStack_458._0_8_ + 1;
      lVar74 = (long)(this->ConfigData).Size;
      iVar185 = CONCAT13(lVar74 <= lVar94,(int3)iVar185);
      pIVar84 = this;
    } while (lVar94 < lVar74);
  }
  auVar95 = (undefined1  [8])0x0;
  if (0 < iVar14) {
    lVar94 = 0;
    auVar95 = (undefined1  [8])0x0;
    do {
      lVar74 = lVar94 * 0x110;
      pvVar64 = (void *)((long)*(int *)((long)pvStack_490 + lVar74 + 0xe0) * 0x20 +
                        (long)pvStack_430);
      ImBitVector::Create((ImBitVector *)((long)pvStack_490 + lVar74 + 0xf0),
                          *(int *)((long)pvStack_490 + lVar74 + 0xe4) + 1);
      if (*(int *)((long)pvVar64 + 0x10) == 0) {
        ImBitVector::Create((ImBitVector *)((long)pvVar64 + 0x10),*(int *)((long)pvVar64 + 4) + 1);
      }
      auStack_458._0_8_ = lVar94;
      psVar83 = (stbtt_fontinfo *)((long)pvStack_490 + lVar74);
      puVar76 = *(ushort **)&psVar83[1].indexToLocFormat;
      uVar54 = *puVar76;
      if (uVar54 != 0) {
        auStack_478._0_8_ = pvVar64;
        do {
          uVar113 = puVar76[1];
          if (uVar113 == 0) break;
          auStack_4b8 = auVar95;
          if (uVar54 <= uVar113) {
            uVar62 = (uint)uVar54;
            lVar94 = *(long *)(auStack_478._0_8_ + 0x18);
            do {
              auVar116 = _auStack_4b8;
              uVar98 = 1 << ((byte)uVar62 & 0x1f);
              if (((*(uint *)(lVar94 + (ulong)(uVar62 >> 5) * 4) >> (uVar62 & 0x1f) & 1) == 0) &&
                 (iVar63 = stbtt_FindGlyphIndex(psVar83,uVar62), iVar63 != 0)) {
                piVar66 = &psVar83[1].cff.cursor;
                *piVar66 = *piVar66 + 1;
                *(int *)(auStack_478._0_8_ + 8) = *(int *)(auStack_478._0_8_ + 8) + 1;
                uVar65 = (ulong)((uVar62 >> 5) << 2);
                puVar1 = (uint *)(*(long *)&psVar83[1].charstrings.cursor + uVar65);
                *puVar1 = *puVar1 | uVar98;
                puVar1 = (uint *)(lVar94 + uVar65);
                *puVar1 = *puVar1 | uVar98;
                iVar63 = auStack_4b8._0_4_;
                auStack_4b8._4_4_ = 0;
                auStack_4b8._0_4_ = iVar63 + 1;
                _fStack_4b0 = auVar116._8_8_;
              }
              uVar62 = uVar62 + 1;
            } while (uVar113 + 1 != uVar62);
          }
          uVar54 = puVar76[2];
          puVar76 = puVar76 + 2;
          auVar95 = auStack_4b8;
        } while (uVar54 != 0);
      }
      lVar94 = auStack_458._0_8_ + 1;
    } while (lVar94 < iVar14);
  }
  auStack_4b8 = auVar95;
  if (0 < iVar14) {
    lVar94 = 0;
    do {
      lVar74 = lVar94 * 0x110;
      iVar63 = *(int *)((long)pvStack_490 + lVar74 + 0xe8);
      if (*(int *)((long)pvStack_490 + lVar74 + 0x104) < iVar63) {
        pvVar67 = ImGui::MemAlloc((long)iVar63 << 2);
        pvVar64 = *(void **)((long)pvStack_490 + lVar74 + 0x108);
        if (pvVar64 != (void *)0x0) {
          memcpy(pvVar67,pvVar64,(long)*(int *)((long)pvStack_490 + lVar74 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvStack_490 + lVar74 + 0x108));
        }
        *(void **)((long)pvStack_490 + lVar74 + 0x108) = pvVar67;
        *(int *)((long)pvStack_490 + lVar74 + 0x104) = iVar63;
      }
      auStack_458._0_8_ = lVar94;
      lVar94 = (long)*(int *)((long)pvStack_490 + lVar74 + 0xf0);
      if (0 < lVar94) {
        puVar77 = *(uint **)((long)pvStack_490 + lVar74 + 0xf8);
        puVar1 = puVar77 + lVar94;
        iVar63 = 0;
        do {
          auStack_478._0_8_ = puVar77;
          uVar62 = *puVar77;
          if (uVar62 != 0) {
            uVar98 = 0;
            do {
              if ((uVar62 >> (uVar98 & 0x1f) & 1) != 0) {
                iVar96 = *(int *)((long)pvStack_490 + lVar74 + 0x100);
                iVar93 = *(int *)((long)pvStack_490 + lVar74 + 0x104);
                if (iVar96 == iVar93) {
                  if (iVar93 == 0) {
                    iVar73 = 8;
                  }
                  else {
                    iVar73 = iVar93 / 2 + iVar93;
                  }
                  iVar96 = iVar96 + 1;
                  if (iVar96 < iVar73) {
                    iVar96 = iVar73;
                  }
                  if (iVar93 < iVar96) {
                    pvVar67 = ImGui::MemAlloc((long)iVar96 << 2);
                    pvVar64 = *(void **)((long)pvStack_490 + lVar74 + 0x108);
                    if (pvVar64 != (void *)0x0) {
                      memcpy(pvVar67,pvVar64,(long)*(int *)((long)pvStack_490 + lVar74 + 0x100) << 2
                            );
                      ImGui::MemFree(*(void **)((long)pvStack_490 + lVar74 + 0x108));
                    }
                    *(void **)((long)pvStack_490 + lVar74 + 0x108) = pvVar67;
                    *(int *)((long)pvStack_490 + lVar74 + 0x104) = iVar96;
                  }
                }
                *(uint *)(*(long *)((long)pvStack_490 + lVar74 + 0x108) +
                         (long)*(int *)((long)pvStack_490 + lVar74 + 0x100) * 4) = iVar63 + uVar98;
                piVar66 = (int *)((long)pvStack_490 + lVar74 + 0x100);
                *piVar66 = *piVar66 + 1;
              }
              uVar98 = uVar98 + 1;
            } while (uVar98 != 0x20);
          }
          puVar77 = (uint *)(auStack_478._0_8_ + 4);
          iVar63 = iVar63 + 0x20;
        } while (puVar77 < puVar1);
      }
      pvVar64 = *(void **)((long)pvStack_490 + lVar74 + 0xf8);
      uVar153 = auStack_458._0_8_;
      if (pvVar64 != (void *)0x0) {
        *(undefined8 *)((long)pvStack_490 + lVar74 + 0xf0) = 0;
        ImGui::MemFree(pvVar64);
        *(undefined8 *)((long)pvStack_490 + lVar74 + 0xf8) = 0;
      }
      lVar94 = uVar153 + 1;
    } while (lVar94 < iVar14);
  }
  uVar62 = SUB84(auVar95,0);
  if (0 < (int)uStack_438) {
    lVar94 = 0x18;
    lVar74 = 0;
    do {
      pvVar64 = pvStack_430;
      if (*(void **)((long)pvStack_430 + lVar94) != (void *)0x0) {
        *(undefined8 *)((long)pvStack_430 + lVar94 + -8) = 0;
        ImGui::MemFree(*(void **)((long)pvStack_430 + lVar94));
        *(undefined8 *)((long)pvVar64 + lVar94) = 0;
      }
      lVar74 = lVar74 + 1;
      lVar94 = lVar94 + 0x20;
    } while (lVar74 < (int)uStack_438);
  }
  if (pvStack_430 != (void *)0x0) {
    uStack_438 = 0;
    ImGui::MemFree(pvStack_430);
    pvStack_430 = (void *)0x0;
  }
  auStack_448 = ZEXT816(0);
  uStack_428 = 0;
  pvStack_420 = (void *)0x0;
  if (0 < (int)uVar62) {
    uVar98 = 8;
    if (7 < (int)uVar62) {
      uVar98 = uVar62;
    }
    if (0 < (int)uVar98) {
      pvVar64 = ImGui::MemAlloc((long)(int)uVar98 << 4);
      if ((void *)auStack_448._8_8_ != (void *)0x0) {
        memcpy(pvVar64,(void *)auStack_448._8_8_,(long)(int)auStack_448._0_4_ << 4);
        ImGui::MemFree((void *)auStack_448._8_8_);
      }
      auVar116._4_8_ = pvVar64;
      auVar116._0_4_ = uVar98;
      auVar116._12_4_ = 0;
      auStack_448 = auVar116 << 0x20;
    }
  }
  auStack_448._0_4_ = uVar62;
  if (uStack_428._4_4_ < (int)uVar62) {
    if (uStack_428._4_4_ == 0) {
      uVar98 = 8;
    }
    else {
      uVar98 = uStack_428._4_4_ / 2 + uStack_428._4_4_;
    }
    if ((int)uVar98 <= (int)uVar62) {
      uVar98 = uVar62;
    }
    if (uStack_428._4_4_ < (int)uVar98) {
      pvVar64 = ImGui::MemAlloc((long)(int)uVar98 * 0x1c);
      if (pvStack_420 != (void *)0x0) {
        memcpy(pvVar64,pvStack_420,(long)(int)(stbtt_uint32)uStack_428 * 0x1c);
        ImGui::MemFree(pvStack_420);
      }
      uStack_428 = (ulong)uVar98 << 0x20;
      pvStack_420 = pvVar64;
    }
  }
  uStack_428 = CONCAT44(uStack_428._4_4_,uVar62);
  iVar63 = 0;
  atlas = pIVar84;
  memset((void *)auStack_448._8_8_,0,(long)(int)auStack_448._0_4_ << 4);
  memset(pvStack_420,0,(long)(int)(stbtt_uint32)uStack_428 * 0x1c);
  fVar115 = 0.0;
  if (0 < iVar14) {
    lVar94 = 0;
    iVar93 = 0;
    iVar96 = 0;
    do {
      iVar73 = *(int *)((long)pvStack_490 + lVar94 * 0x110 + 0xe8);
      if (iVar73 != 0) {
        psVar83 = (stbtt_fontinfo *)((long)pvStack_490 + lVar94 * 0x110);
        *(long *)&psVar83[1].hmtx = (long)iVar93 * 0x10 + auStack_448._8_8_;
        pvVar64 = (void *)((long)iVar96 * 0x1c + (long)pvStack_420);
        *(void **)&psVar83[1].gpos = pvVar64;
        pIVar91 = (pIVar84->ConfigData).Data;
        fVar115 = pIVar91[lVar94].SizePixels;
        uVar151 = 0;
        uVar169 = 0;
        uVar123 = 0;
        *(float *)&psVar83[1].userdata = fVar115;
        *(undefined4 *)((long)&psVar83[1].userdata + 4) = 0;
        psVar83[1].data = *(uchar **)&psVar83[1].gsubrs.cursor;
        psVar83[1].fontstart = *(int *)&psVar83[1].gsubrs.data;
        *(void **)&psVar83[1].loca = pvVar64;
        *(char *)&psVar83[1].glyf = (char)pIVar91[lVar94].OversampleH;
        *(char *)((long)&psVar83[1].glyf + 1) = (char)pIVar91[lVar94].OversampleV;
        if (fVar115 <= 0.0) {
          uVar151 = 0x80000000;
          uVar169 = 0x80000000;
          uVar123 = 0x80000000;
          fVar115 = -fVar115;
          uVar62 = (uint)(ushort)(*(ushort *)(psVar83->data + (long)psVar83->head + 0x12) << 8 |
                                 *(ushort *)(psVar83->data + (long)psVar83->head + 0x12) >> 8);
        }
        else {
          puVar68 = psVar83->data;
          lVar74 = (long)psVar83->hhea;
          uVar62 = ((int)(short)((ushort)puVar68[lVar74 + 4] << 8) | (uint)puVar68[lVar74 + 5]) -
                   ((int)(short)((ushort)puVar68[lVar74 + 6] << 8) | (uint)puVar68[lVar74 + 7]);
          pIVar84 = atlas;
        }
        fVar115 = fVar115 / (float)(int)uVar62;
        iVar93 = iVar93 + iVar73;
        iVar96 = iVar96 + iVar73;
        if (0 < *(int *)&psVar83[1].gsubrs.data) {
          auStack_458._0_4_ = iVar96;
          auStack_478._0_8_ = lVar94;
          iVar96 = pIVar84->TexGlyphPadding;
          lVar99 = 6;
          lVar74 = 0;
          auStack_4b8._4_4_ = uVar151;
          auStack_4b8._0_4_ = fVar115;
          fStack_4b0 = (float)uVar169;
          fStack_4ac = (float)uVar123;
          pIVar84 = atlas;
          do {
            iVar73 = stbtt_FindGlyphIndex
                               (psVar83,*(int *)(*(long *)&psVar83[1].gsubrs.cursor + lVar74 * 4));
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar83,iVar73,(float)pIVar91[lVar94].OversampleH * fVar115,
                       (float)pIVar91[lVar94].OversampleV * fVar115,fVar115,in_XMM3._0_4_,
                       (int *)asStack_288,(int *)auStack_488,(int *)&uStack_410,
                       (int *)&stack0xfffffffffffffb64);
            uVar62 = (pIVar91[lVar94].OversampleH +
                     (((stbtt_uint32)uStack_410 + iVar96) - (int)asStack_288[0].data)) - 1;
            lVar80 = *(long *)&psVar83[1].hmtx;
            *(short *)(lVar80 + -2 + lVar99) = (short)uVar62;
            uVar98 = (pIVar91[lVar94].OversampleV +
                     ((in_stack_fffffffffffffb64 + iVar96) - auStack_488._0_4_)) - 1;
            *(short *)(lVar80 + lVar99) = (short)uVar98;
            iVar63 = iVar63 + (uVar98 & 0xffff) * (uVar62 & 0xffff);
            lVar74 = lVar74 + 1;
            lVar99 = lVar99 + 0x10;
          } while (lVar74 < *(int *)&psVar83[1].gsubrs.data);
          lVar94 = auStack_478._0_8_;
          iVar96 = auStack_458._0_4_;
          atlas = pIVar84;
        }
      }
      lVar94 = lVar94 + 1;
    } while (lVar94 < iVar14);
    fVar115 = (float)iVar63;
  }
  if (fVar115 < 0.0) {
    fVar115 = sqrtf(fVar115);
  }
  else {
    fVar115 = SQRT(fVar115);
  }
  pIVar84->TexHeight = 0;
  iVar63 = pIVar84->TexDesiredWidth;
  if (iVar63 < 1) {
    iVar96 = (int)fVar115;
    iVar63 = 0x1000;
    if ((iVar96 < 0xb33) && (iVar63 = 0x800, iVar96 < 0x599)) {
      iVar63 = (uint)(0x2cb < iVar96) * 0x200 + 0x200;
    }
  }
  pIVar84->TexWidth = iVar63;
  auStack_488._12_4_ = pIVar84->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar96 = iVar63 - auStack_488._12_4_;
  psStack_418 = (stbrp_node *)ImGui::MemAlloc((long)iVar96 << 4);
  if ((ptr == (stbrp_context *)0x0) || (psStack_418 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (psStack_418 != (stbrp_node *)0x0) {
      ImGui::MemFree(psStack_418);
    }
    psStack_418 = (stbrp_node *)0x0;
    auStack_488._12_4_ = 0.0;
    iVar63 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (iVar96 < 2) {
      uVar65 = 0;
    }
    else {
      uVar65 = 0;
      psVar33 = psStack_418;
      do {
        uVar65 = uVar65 + 1;
        psVar33->next = psVar33 + 1;
        psVar33 = psVar33 + 1;
      } while (iVar96 - 1 != uVar65);
      uVar65 = uVar65 & 0xffffffff;
    }
    psStack_418[uVar65].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = psStack_418;
    ptr->active_head = ptr->extra;
    ptr->width = iVar96;
    ptr->height = 0x8000 - auStack_488._12_4_;
    ptr->num_nodes = iVar96;
    ptr->align = (iVar96 * 2 + -1) / iVar96;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar96;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  psStack_360 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas,ptr);
  if (0 < iVar14) {
    lVar94 = 0;
    do {
      lVar74 = lVar94 * 0x110;
      iVar96 = *(int *)((long)pvStack_490 + lVar74 + 0xe8);
      if (iVar96 != 0) {
        stbrp_pack_rects(psStack_360,*(stbrp_rect **)((long)pvStack_490 + lVar74 + 200),iVar96);
        lVar99 = (long)*(int *)((long)pvStack_490 + lVar74 + 0xe8);
        if (0 < lVar99) {
          lVar74 = *(long *)((long)pvStack_490 + lVar74 + 200);
          lVar80 = 0;
          do {
            if (*(int *)(lVar74 + 0xc + lVar80) != 0) {
              iVar96 = (uint)*(ushort *)(lVar74 + 6 + lVar80) +
                       (uint)*(ushort *)(lVar74 + 10 + lVar80);
              if (iVar96 < atlas->TexHeight) {
                iVar96 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar96;
            }
            lVar80 = lVar80 + 0x10;
          } while (lVar99 * 0x10 != lVar80);
        }
      }
      lVar94 = lVar94 + 1;
    } while (lVar94 < iVar14);
  }
  uVar62 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar62 = (int)(uVar62 - 1) >> 1 | uVar62 - 1;
    uVar62 = (int)uVar62 >> 2 | uVar62;
    uVar62 = (int)uVar62 >> 4 | uVar62;
    uVar62 = (int)uVar62 >> 8 | uVar62;
    uVar62 = (int)uVar62 >> 0x10 | uVar62;
  }
  iVar96 = uVar62 + 1;
  atlas->TexHeight = iVar96;
  auVar118._0_4_ = (float)atlas->TexWidth;
  auVar118._4_4_ = (float)iVar96;
  auVar118._8_8_ = 0;
  auVar116 = divps(_DAT_00166f40,auVar118);
  atlas->TexUvScale = auVar116._0_8_;
  puVar68 = (uchar *)ImGui::MemAlloc((long)(iVar96 * atlas->TexWidth));
  atlas->TexPixelsAlpha8 = puVar68;
  pIVar84 = atlas;
  memset(puVar68,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  if (0 < iVar14) {
    puStack_3c0 = atlas->TexPixelsAlpha8;
    lStack_460 = (long)iVar63;
    auStack_68 = pshuflw(ZEXT416((uint)auStack_488._12_4_),ZEXT416((uint)auStack_488._12_4_),0);
    iStack_37c = iVar63;
    lVar94 = 0;
    auVar118 = _DAT_00166f00;
    auVar116 = _DAT_001695d0;
    do {
      if (*(int *)((long)pvStack_490 + lVar94 * 0x110 + 0xe8) != 0) {
        psVar83 = (stbtt_fontinfo *)((long)pvStack_490 + lVar94 * 0x110);
        fStack_328 = *(float *)&psVar83[1].userdata;
        lStack_300 = lVar94;
        if (fStack_328 <= 0.0) {
          fStack_328 = (float)((uint)fStack_328 ^ auVar118._0_4_);
          uStack_324 = auVar118._4_4_;
          uStack_320 = auVar118._8_4_;
          uStack_31c = auVar118._12_4_;
          uVar62 = (uint)(ushort)(*(ushort *)(psVar83->data + (long)psVar83->head + 0x12) << 8 |
                                 *(ushort *)(psVar83->data + (long)psVar83->head + 0x12) >> 8);
        }
        else {
          puVar68 = psVar83->data;
          lVar94 = (long)psVar83->hhea;
          uVar62 = ((int)(short)((ushort)puVar68[lVar94 + 4] << 8) | (uint)puVar68[lVar94 + 5]) -
                   ((int)(short)((ushort)puVar68[lVar94 + 6] << 8) | (uint)puVar68[lVar94 + 7]);
          uStack_324 = 0;
          uStack_320 = 0;
          uStack_31c = 0;
        }
        fStack_328 = fStack_328 / (float)(int)uVar62;
        pIStack_308 = (atlas->ConfigData).Data;
        atlas = pIVar84;
        if (0 < psVar83[1].fontstart) {
          lVar94._0_4_ = psVar83[1].hmtx;
          lVar94._4_4_ = psVar83[1].kern;
          uStack_298._0_4_ = psVar83[1].glyf;
          uStack_298._4_4_ = psVar83[1].hhea;
          uStack_290 = 0;
          auVar44._8_6_ = 0;
          auVar44._0_8_ = uStack_298;
          auVar44[0xe] = (char)((uint)uStack_298._4_4_ >> 0x18);
          auVar47._8_4_ = 0;
          auVar47._0_8_ = uStack_298;
          auVar47[0xc] = (char)((uint)uStack_298._4_4_ >> 0x10);
          auVar47._13_2_ = auVar44._13_2_;
          auVar48._8_4_ = 0;
          auVar48._0_8_ = uStack_298;
          auVar48._12_3_ = auVar47._12_3_;
          auVar49._8_2_ = 0;
          auVar49._0_8_ = uStack_298;
          auVar49[10] = (char)((uint)uStack_298._4_4_ >> 8);
          auVar49._11_4_ = auVar48._11_4_;
          auVar50._8_2_ = 0;
          auVar50._0_8_ = uStack_298;
          auVar50._10_5_ = auVar49._10_5_;
          auVar51[8] = (char)uStack_298._4_4_;
          auVar51._0_8_ = uStack_298;
          auVar51._9_6_ = auVar50._9_6_;
          cVar111 = (char)((uint)(undefined4)uStack_298 >> 0x18);
          Var37 = CONCAT91((unkuint9)auVar51._8_7_ << 8,cVar111);
          auVar42[10] = 0;
          auVar42._0_10_ = Var37;
          cVar110 = (char)((uint)(undefined4)uStack_298 >> 0x10);
          auVar36._1_11_ = auVar42 << 8;
          auVar36[0] = cVar110;
          auVar41[0xc] = 0;
          auVar41._0_12_ = auVar36;
          bVar109 = (byte)((uint)(undefined4)uStack_298 >> 8);
          auVar35._1_13_ = auVar41 << 8;
          auVar35[0] = bVar109;
          bVar101 = (byte)(undefined4)uStack_298;
          auVar164._0_2_ = CONCAT11(0,bVar101);
          auVar164._2_14_ = auVar35;
          uVar54 = auVar35._0_2_;
          sVar13 = -auVar36._0_2_;
          uVar113 = (ushort)Var37;
          sVar55 = -uVar113;
          uStack_3d8 = (ulong)uVar54;
          auVar45._10_2_ = 0;
          auVar45._0_10_ = auVar164._0_10_;
          auVar45._12_2_ = uVar113;
          uVar52 = CONCAT42(auVar45._10_4_,auVar36._0_2_);
          auVar103._4_2_ = uVar54;
          auVar103._0_4_ = auVar164._0_4_;
          auVar103._6_10_ = (unkuint10)uVar52 << 0x10;
          auVar104._0_4_ = (float)auVar164._0_2_;
          auVar104._4_4_ = (float)auVar103._4_4_;
          auVar104._8_4_ = (float)(int)uVar52;
          auVar104._12_4_ = (float)uVar113;
          auStack_58 = divps(_DAT_00166f40,auVar104);
          auVar135[0] = -(bVar101 == 0);
          auVar135[1] = -(bVar101 == 0);
          auVar135[2] = -(bVar101 == 0);
          auVar135[3] = -(bVar101 == 0);
          auVar135[4] = -(bVar109 == 0);
          auVar135[5] = -(bVar109 == 0);
          auVar135[6] = -(bVar109 == 0);
          auVar135[7] = -(bVar109 == 0);
          auVar135[8] = -(cVar110 == '\0');
          auVar135[9] = -(cVar110 == '\0');
          auVar135[10] = -(cVar110 == '\0');
          auVar135[0xb] = -(cVar110 == '\0');
          auVar135[0xc] = -(cVar111 == '\0');
          auVar135[0xd] = -(cVar111 == '\0');
          auVar135[0xe] = -(cVar111 == '\0');
          auVar135[0xf] = -(cVar111 == '\0');
          Var40 = CONCAT64(CONCAT42(CONCAT22(sVar55,sVar55),sVar13),CONCAT22(sVar13,sVar55));
          auVar38._4_8_ = (long)((unkuint10)Var40 >> 0x10);
          auVar38._2_2_ = 1 - uVar54;
          auVar38._0_2_ = 1 - uVar54;
          auVar117._0_4_ = (float)(int)(short)(1 - auVar164._0_2_);
          auVar117._4_4_ = (float)(auVar38._0_4_ >> 0x10);
          auVar117._8_4_ = (float)((int)((unkuint10)Var40 >> 0x10) >> 0x10);
          auVar117._12_4_ = (float)(int)sVar55;
          fStack_2a8 = fStack_328 * auVar104._0_4_;
          fStack_2b8 = fStack_328 * auVar104._4_4_;
          auVar105._0_4_ = auVar104._0_4_ + auVar104._0_4_;
          auVar105._4_4_ = auVar104._4_4_ + auVar104._4_4_;
          auVar105._8_4_ = auVar104._8_4_ + auVar104._8_4_;
          auVar105._12_4_ = auVar104._12_4_ + auVar104._12_4_;
          auVar118 = divps(auVar117,auVar105);
          auStack_48._0_16_ = ~auVar135 & auVar118;
          fVar115 = fStack_2b8;
          if (fStack_2a8 <= fStack_2b8) {
            fVar115 = fStack_2a8;
          }
          fStack_3d0 = (0.35 / fVar115) * (0.35 / fVar115);
          fStack_2b4 = fStack_2b8;
          fStack_2b0 = fStack_2b8;
          fStack_2ac = fStack_2b8;
          fStack_74 = (float)((uint)fStack_2b8 ^ (uint)DAT_00166f00);
          uStack_338 = uStack_298 & 0xff;
          uStack_340 = (ulong)bVar109;
          uStack_468 = (ulong)(auVar164._0_4_ & 0xffff);
          fStack_2a4 = fStack_2b8;
          fStack_2a0 = fStack_328 * auVar104._8_4_;
          fStack_29c = fStack_328 * auVar104._12_4_;
          fStack_78 = fStack_2a8;
          fStack_70 = fStack_2a8;
          fStack_6c = fStack_74;
          lVar74 = 0;
          lStack_2f8 = lVar94;
          psStack_350 = psVar83;
          auVar118 = _DAT_00166f00;
          uVar62 = in_stack_fffffffffffffb64;
          do {
            fVar115 = 0.0;
            in_stack_fffffffffffffb64 = uVar62;
            if (*(int *)(lVar94 + 0xc + lVar74 * 0x10) != 0) {
              lVar99 = lVar74 * 0x10 + lVar94;
              sVar13 = *(short *)(lVar99 + 4);
              if ((sVar13 != 0) && (sVar55 = *(short *)(lVar99 + 6), sVar55 != 0)) {
                if (psVar83[1].data == (uchar *)0x0) {
                  iVar63 = *(int *)((long)&psVar83[1].userdata + 4) + (int)lVar74;
                }
                else {
                  iVar63 = *(int *)(psVar83[1].data + lVar74 * 4);
                }
                puStack_2f0 = (undefined4 *)(lVar74 * 0x1c + *(long *)&psVar83[1].loca);
                lStack_2e8 = lVar74;
                iVar96 = stbtt_FindGlyphIndex(psVar83,iVar63);
                fVar102 = auVar116._0_4_;
                *(uint *)(lVar99 + 8) =
                     CONCAT22((short)((uint)*(undefined4 *)(lVar99 + 8) >> 0x10) + auStack_68._2_2_,
                              (short)*(undefined4 *)(lVar99 + 8) + auStack_68._0_2_);
                *(short *)(lVar99 + 4) = sVar13 - (short)auStack_488._12_4_;
                *(short *)(lVar99 + 6) = sVar55 - (short)auStack_488._12_4_;
                puVar68 = psVar83->data;
                uVar54 = *(ushort *)(puVar68 + (long)psVar83->hhea + 0x22) << 8 |
                         *(ushort *)(puVar68 + (long)psVar83->hhea + 0x22) >> 8;
                iVar63 = psVar83->hmtx;
                lVar94 = (ulong)uVar54 * 4 + (long)iVar63 + -4;
                lVar74 = (ulong)uVar54 * 4 + (long)iVar63 + -3;
                if (iVar96 < (int)(uint)uVar54) {
                  lVar94 = (long)(iVar96 * 4) + (long)iVar63;
                  lVar74 = (long)(iVar96 * 4) + 1 + (long)iVar63;
                }
                uStack_380 = (uint)puVar68[lVar94];
                uStack_384 = (uint)puVar68[lVar74];
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar83,iVar96,fStack_2a8,fStack_2b8,fVar115,fVar102,&iStack_368,
                           &iStack_36c,&iStack_2bc,&iStack_2c0);
                auVar116 = auStack_458;
                auStack_458._2_6_ = 0;
                auStack_458._0_2_ = *(ushort *)(lVar99 + 8);
                auStack_458._8_8_ = auVar116._8_8_;
                puStack_3a8 = (uchar *)(ulong)*(ushort *)(lVar99 + 10);
                uStack_3f0 = (ulong)*(ushort *)(lVar99 + 4);
                uStack_3c8 = (ulong)*(ushort *)(lVar99 + 6);
                lStack_3b8 = lVar99;
                uVar98 = stbtt_GetGlyphShape(psVar83,iVar96,(stbtt_vertex **)&uStack_410);
                uVar82 = ((int)uStack_3f0 - (int)uStack_468) + 1;
                uStack_358 = (ulong)(uint)-(int)uStack_3d8;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psStack_350,iVar96,fStack_2a8,fStack_2b8,fVar115,fVar102,
                           (int *)&stack0xfffffffffffffb64,&iStack_364,(int *)0x0,(int *)0x0);
                in_stack_fffffffffffffb64 = uVar62;
                uStack_3fc = uVar82;
                if (uVar82 != 0) {
                  iVar63 = (int)uStack_358 + (int)uStack_3c8 + 1;
                  auStack_3e8._0_4_ = iVar63;
                  if (iVar63 != 0) {
                    lVar94 = CONCAT44(uStack_410._4_4_,(stbtt_uint32)uStack_410);
                    iStack_404 = iStack_364;
                    asStack_288[0].data = (uchar *)((ulong)asStack_288[0].data & 0xffffffff00000000)
                    ;
                    if ((int)uVar98 < 1) {
                      uVar65 = 0;
                    }
                    else {
                      lVar74 = 0;
                      uVar65 = 0;
                      do {
                        uVar65 = (ulong)((int)uVar65 +
                                        (uint)(*(char *)(lVar94 + 0xc + lVar74) == '\x01'));
                        lVar74 = lVar74 + 0xe;
                      } while ((ulong)uVar98 * 0xe != lVar74);
                    }
                    if ((int)uVar65 == 0) {
LAB_001388ea:
                      pvVar64 = (void *)0x0;
LAB_001388ed:
                      points = (stbtt__point *)0x0;
                    }
                    else {
                      pvVar64 = ImGui::MemAlloc((long)(int)uVar65 << 2);
                      if (pvVar64 == (void *)0x0) {
                        uVar65 = 0;
                        goto LAB_001388ed;
                      }
                      uVar82 = 0;
                      auVar95 = (undefined1  [8])0x0;
                      points = (stbtt__point *)0x0;
                      pvStack_3f8 = pvVar64;
                      do {
                        auVar116 = auStack_478;
                        auStack_478._4_4_ = 0;
                        auStack_478._0_4_ = uVar82;
                        uVar87 = auStack_478._0_8_;
                        auStack_478 = auVar116;
                        if (uVar82 == 0) {
LAB_001386b9:
                          asStack_288[0].data =
                               (uchar *)((ulong)asStack_288[0].data & 0xffffffff00000000);
                          if ((int)uVar98 < 1) {
                            lVar74 = -1;
                          }
                          else {
                            auStack_4b8 = auVar95;
                            auStack_478 = CONCAT88(auStack_478._8_8_,uVar87);
                            fVar115 = 0.0;
                            fVar102 = 0.0;
                            uVar82 = 0xffffffff;
                            lVar74 = 0;
                            do {
                              puVar68 = asStack_288[0].data;
                              switch(*(undefined1 *)(lVar94 + 0xc + lVar74)) {
                              case 1:
                                if (-1 < (int)uVar82) {
                                  *(int *)((long)pvStack_3f8 + (ulong)uVar82 * 4) =
                                       (int)asStack_288[0].data - auStack_4b8._0_4_;
                                }
                                uVar82 = uVar82 + 1;
                                auVar116 = pshuflw(ZEXT416(*(uint *)(lVar94 + lVar74)),
                                                   ZEXT416(*(uint *)(lVar94 + lVar74)),0x60);
                                iVar63 = auVar116._0_4_;
                                iVar96 = auVar116._4_4_;
                                auStack_4b8 = (undefined1  [8])
                                              ((ulong)asStack_288[0].data & 0xffffffff);
                                break;
                              case 2:
                                auVar116 = pshuflw(ZEXT416(*(uint *)(lVar94 + lVar74)),
                                                   ZEXT416(*(uint *)(lVar94 + lVar74)),0x60);
                                iVar63 = auVar116._0_4_;
                                iVar96 = auVar116._4_4_;
                                break;
                              case 3:
                                stbtt__tesselate_curve
                                          (points,(int *)asStack_288,fVar115,fVar102,
                                           (float)(int)*(short *)(lVar94 + 4 + lVar74),
                                           (float)(int)*(short *)(lVar94 + 6 + lVar74),
                                           (float)(int)*(short *)(lVar94 + lVar74),
                                           (float)(int)*(short *)(lVar94 + 2 + lVar74),fStack_3d0,0)
                                ;
                                goto LAB_0013882a;
                              case 4:
                                stbtt__tesselate_cubic
                                          (points,(int *)asStack_288,fVar115,fVar102,
                                           (float)(int)*(short *)(lVar94 + 4 + lVar74),
                                           (float)(int)*(short *)(lVar94 + 6 + lVar74),
                                           (float)(int)*(short *)(lVar94 + 8 + lVar74),
                                           (float)(int)*(short *)(lVar94 + 10 + lVar74),
                                           (float)(int)*(short *)(lVar94 + lVar74),
                                           (float)(int)*(short *)(lVar94 + 2 + lVar74),fStack_3d0,0)
                                ;
LAB_0013882a:
                                auVar116 = pshuflw(ZEXT416(*(uint *)(lVar94 + lVar74)),
                                                   ZEXT416(*(uint *)(lVar94 + lVar74)),0x60);
                                fVar115 = (float)(auVar116._0_4_ >> 0x10);
                                fVar102 = (float)(auVar116._4_4_ >> 0x10);
                                puVar68 = asStack_288[0].data;
                              default:
                                goto switchD_00138703_default;
                              }
                              puVar68 = (uchar *)CONCAT44(asStack_288[0].data._4_4_,
                                                          (int)asStack_288[0].data + 1);
                              fVar102 = (float)(iVar96 >> 0x10);
                              fVar115 = (float)(iVar63 >> 0x10);
                              if (points != (stbtt__point *)0x0) {
                                points[(int)asStack_288[0].data].x = fVar115;
                                points[(int)asStack_288[0].data].y = fVar102;
                              }
switchD_00138703_default:
                              asStack_288[0].data = puVar68;
                              lVar74 = lVar74 + 0xe;
                            } while ((ulong)uVar98 * 0xe != lVar74);
                            lVar74 = (long)(int)uVar82;
                            uVar82 = auStack_478._0_4_;
                            auVar95 = auStack_4b8;
                          }
                          *(int *)((long)pvStack_3f8 + lVar74 * 4) =
                               (int)asStack_288[0].data - SUB84(auVar95,0);
                          bVar53 = true;
                          uVar124 = uVar82;
                        }
                        else {
                          points = (stbtt__point *)
                                   ImGui::MemAlloc((long)(int)asStack_288[0].data << 3);
                          if (points != (stbtt__point *)0x0) goto LAB_001386b9;
                          points = (stbtt__point *)0x0;
                          bVar53 = false;
                          uVar124 = uVar82;
                        }
                        if (!bVar53) {
                          ImGui::MemFree(points);
                          ImGui::MemFree(pvStack_3f8);
                          uVar65 = 0;
                          goto LAB_001388ea;
                        }
                        uVar82 = uVar124 + 1;
                        pvVar64 = pvStack_3f8;
                      } while (uVar124 == 0);
                    }
                    psStack_3b0 = points;
                    if (points != (stbtt__point *)0x0) {
                      if ((int)uVar65 < 1) {
                        size = 0x14;
                      }
                      else {
                        uVar87 = 0;
                        lVar94 = 0;
                        do {
                          lVar94 = (long)(int)lVar94 + (long)*(int *)((long)pvVar64 + uVar87 * 4);
                          uVar87 = uVar87 + 1;
                        } while (uVar65 != uVar87);
                        size = lVar94 * 0x14 + 0x14;
                      }
                      psVar69 = (stbtt__edge *)ImGui::MemAlloc(size);
                      if (psVar69 != (stbtt__edge *)0x0) {
                        if ((int)uVar65 < 1) {
                          uVar98 = 0;
                        }
                        else {
                          uVar87 = 0;
                          uVar98 = 0;
                          iVar63 = 0;
                          do {
                            iVar96 = *(int *)((long)pvVar64 + uVar87 * 4);
                            if (0 < iVar96) {
                              uVar81 = (ulong)(iVar96 - 1);
                              uVar89 = 0;
                              do {
                                iVar93 = (int)uVar81;
                                fVar115 = psStack_3b0[(long)iVar63 + (long)iVar93].y;
                                fVar102 = psStack_3b0[(long)iVar63 + uVar89].y;
                                if ((fVar115 != fVar102) || (NAN(fVar115) || NAN(fVar102))) {
                                  iVar92 = (int)uVar89;
                                  iVar73 = iVar93;
                                  if (fVar115 <= fVar102) {
                                    iVar73 = iVar92;
                                    iVar92 = iVar93;
                                  }
                                  psVar69[(int)uVar98].invert = (uint)(fVar102 < fVar115);
                                  sVar5 = psStack_3b0[(long)iVar63 + (long)iVar73];
                                  sVar6 = psStack_3b0[(long)iVar63 + (long)iVar92];
                                  psVar88 = psVar69 + (int)uVar98;
                                  psVar88->x0 = sVar5.x * fStack_78 + 0.0;
                                  psVar88->y0 = sVar5.y * fStack_74 + 0.0;
                                  psVar88->x1 = sVar6.x * fStack_70 + 0.0;
                                  psVar88->y1 = sVar6.y * fStack_6c + 0.0;
                                  uVar98 = uVar98 + 1;
                                }
                                uVar81 = uVar89 & 0xffffffff;
                                uVar89 = uVar89 + 1;
                              } while ((long)uVar89 < (long)*(int *)((long)pvVar64 + uVar87 * 4));
                            }
                            iVar63 = iVar63 + iVar96;
                            uVar87 = uVar87 + 1;
                          } while (uVar87 != uVar65);
                        }
                        iVar63 = (int)uStack_468;
                        psStack_330 = psVar69;
                        stbtt__sort_edges_quicksort(psVar69,uVar98);
                        if (1 < (int)uVar98) {
                          uVar65 = 1;
                          do {
                            uVar2 = psVar69[uVar65].x0;
                            uVar7 = psVar69[uVar65].y0;
                            iVar96 = psVar69[uVar65].invert;
                            asStack_288[0].cursor = iVar96;
                            asStack_288[0].data = *(uchar **)&psVar69[uVar65].x1;
                            uVar87 = uVar65 & 0xffffffff;
                            do {
                              uVar82 = (uint)uVar87;
                              if ((int)uVar82 < 1) break;
                              fVar115 = psVar69[uVar87 - 1].y0;
                              if ((float)uVar7 < fVar115) {
                                psVar88 = psVar69 + uVar87;
                                psVar88->invert = psVar88[-1].invert;
                                fVar102 = psVar88[-1].y0;
                                fVar141 = psVar88[-1].x1;
                                fVar142 = psVar88[-1].y1;
                                psVar88->x0 = psVar88[-1].x0;
                                psVar88->y0 = fVar102;
                                psVar88->x1 = fVar141;
                                psVar88->y1 = fVar142;
                                uVar87 = (ulong)(uVar82 - 1);
                              }
                              uVar82 = (uint)uVar87;
                            } while ((float)uVar7 < fVar115);
                            if (uVar65 != uVar82) {
                              psVar69[(int)uVar82].x0 = (float)uVar2;
                              psVar69[(int)uVar82].y0 = (float)uVar7;
                              *(uchar **)&psVar69[(int)uVar82].x1 = asStack_288[0].data;
                              psVar69[(int)uVar82].invert = iVar96;
                            }
                            uVar65 = uVar65 + 1;
                          } while (uVar65 != uVar98);
                        }
                        uVar82 = (int)uStack_3f0 - iVar63;
                        uStack_3f0 = (ulong)uVar82;
                        auStack_488._0_8_ = (stbtt__active_edge *)0x0;
                        scanline = asStack_288;
                        if (0x3f < (int)uVar82) {
                          scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)uStack_3fc * 8 + 4);
                        }
                        uVar82 = (int)uStack_3c8 - (int)uStack_3d8;
                        uStack_3c8 = (ulong)uVar82;
                        psVar69[(int)uVar98].y0 = (float)(auStack_3e8._0_4_ + iStack_404) + 1.0;
                        pvStack_3f8 = pvVar64;
                        if (uVar82 < 0x7fffffff) {
                          puStack_3a8 = puStack_3c0 +
                                        (long)puStack_3a8 * lStack_460 + auStack_458._0_8_;
                          fStack_374 = (float)(int)uVar62;
                          lStack_2e0 = (long)(int)uStack_3fc;
                          pfStack_390 = (float *)((long)&scanline->data + lStack_2e0 * 4);
                          pfStack_348 = pfStack_390 + 1;
                          sStack_2d0 = lStack_2e0 * 4;
                          fStack_400 = (float)(int)uStack_3fc;
                          sStack_2d8 = (long)(int)(uint)uStack_3f0 * 4 + 8;
                          uStack_3a0 = 0;
                          uStack_398 = 0;
                          ptr_00 = (undefined8 *)0x0;
                          iStack_3cc = 0;
                          psVar97 = (stbtt__active_edge *)0x0;
                          iStack_378 = iStack_404;
                          do {
                            fVar102 = (float)iStack_378;
                            fVar115 = fVar102 + 1.0;
                            memset(scanline,0,sStack_2d0);
                            memset(pfStack_390,0,sStack_2d8);
                            if ((stbtt__active_edge *)auStack_488._0_8_ != (stbtt__active_edge *)0x0
                               ) {
                              psVar70 = (stbtt__active_edge *)auStack_488._0_8_;
                              psVar78 = (stbtt__active_edge *)auStack_488;
                              do {
                                psVar79 = psVar70;
                                if (psVar70->ey <= fVar102) {
                                  psVar78->next = psVar70->next;
                                  psVar70->direction = 0.0;
                                  psVar70->next = psVar97;
                                  psVar79 = psVar78;
                                  psVar97 = psVar70;
                                }
                                psVar70 = psVar79->next;
                                psVar78 = psVar79;
                              } while (psVar70 != (stbtt__active_edge *)0x0);
                            }
                            fVar141 = psVar69->y0;
                            if (fVar141 <= fVar115) {
                              bVar53 = iStack_404 != 0;
                              bVar100 = (int)uStack_398 == 0;
                              do {
                                if ((fVar141 != psVar69->y1) || (NAN(fVar141) || NAN(psVar69->y1)))
                                {
                                  if (psVar97 == (stbtt__active_edge *)0x0) {
                                    puVar72 = ptr_00;
                                    psVar70 = psVar97;
                                    if (iStack_3cc == 0) {
                                      puVar72 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                      if (puVar72 == (undefined8 *)0x0) {
                                        psVar78 = (stbtt__active_edge *)0x0;
                                        goto LAB_0013939f;
                                      }
                                      *puVar72 = ptr_00;
                                      iStack_3cc = 800;
                                    }
                                    lVar94 = (long)iStack_3cc;
                                    iStack_3cc = iStack_3cc + -1;
                                    psVar78 = (stbtt__active_edge *)(puVar72 + lVar94 * 4 + -3);
                                    ptr_00 = puVar72;
                                  }
                                  else {
                                    psVar70 = psVar97->next;
                                    psVar78 = psVar97;
                                  }
LAB_0013939f:
                                  psVar97 = psVar70;
                                  if (psVar78 != (stbtt__active_edge *)0x0) {
                                    uVar3 = psVar69->x0;
                                    uVar8 = psVar69->y0;
                                    uVar4 = psVar69->x1;
                                    uVar9 = psVar69->y1;
                                    fVar141 = ((float)uVar4 - (float)uVar3) /
                                              ((float)uVar9 - (float)uVar8);
                                    psVar78->fdx = fVar141;
                                    psVar78->fdy = (float)(-(uint)(fVar141 != 0.0) &
                                                          (uint)(1.0 / fVar141));
                                    psVar78->fx = ((fVar102 - (float)uVar8) * fVar141 + (float)uVar3
                                                  ) - fStack_374;
                                    psVar78->direction =
                                         *(float *)(&DAT_00167974 +
                                                   (ulong)(psVar69->invert == 0) * 4);
                                    psVar78->sy = (float)uVar8;
                                    psVar78->ey = (float)uVar9;
                                    psVar78->next = (stbtt__active_edge *)0x0;
                                    if ((float)uVar9 < fVar102 && (bVar100 && bVar53)) {
                                      psVar78->ey = fVar102;
                                    }
                                    psVar78->next = (stbtt__active_edge *)auStack_488._0_8_;
                                    auStack_488._0_8_ = psVar78;
                                  }
                                }
                                fVar141 = psVar69[1].y0;
                                psVar69 = psVar69 + 1;
                              } while (fVar141 <= fVar115);
                            }
                            puStack_2c8 = ptr_00;
                            ptr_00 = puStack_2c8;
                            iVar63 = iStack_378;
                            fVar141 = fStack_318;
                            for (psVar70 = (stbtt__active_edge *)auStack_488._0_8_;
                                fStack_318 = fVar141, puStack_2c8 = ptr_00,
                                psVar70 != (stbtt__active_edge *)0x0; psVar70 = psVar70->next) {
                              fStack_318 = psVar70->fx;
                              fVar142 = psVar70->fdx;
                              iStack_378 = iVar63;
                              if ((fVar142 != 0.0) || (NAN(fVar142))) {
                                fVar147 = fVar142 + fStack_318;
                                fVar143 = psVar70->sy;
                                fVar144 = (float)(~-(uint)(fVar102 < fVar143) & (uint)fStack_318 |
                                                 (uint)((fVar143 - fVar102) * fVar142 + fStack_318)
                                                 & -(uint)(fVar102 < fVar143));
                                if (0.0 <= fVar144) {
                                  fVar148 = psVar70->ey;
                                  fVar149 = (float)(-(uint)(fVar148 < fVar115) &
                                                    (uint)((fVar148 - fVar102) * fVar142 +
                                                          fStack_318) |
                                                   ~-(uint)(fVar148 < fVar115) & (uint)fVar147);
                                  if (((0.0 <= fVar149) && (fVar144 < fStack_400)) &&
                                     (fVar149 < fStack_400)) {
                                    if (fVar143 <= fVar102) {
                                      fVar143 = fVar102;
                                    }
                                    iVar63 = (int)fVar144;
                                    if (fVar115 <= fVar148) {
                                      fVar148 = fVar115;
                                    }
                                    if (iVar63 == (int)fVar149) {
                                      lVar94 = (long)iVar63;
                                      *(float *)((long)&scanline->data + lVar94 * 4) =
                                           (((fVar149 - (float)iVar63) + (fVar144 - (float)iVar63))
                                            * -0.5 + 1.0) * psVar70->direction * (fVar148 - fVar143)
                                           + *(float *)((long)&scanline->data + lVar94 * 4);
                                      fVar147 = (fVar148 - fVar143) * psVar70->direction;
                                    }
                                    else {
                                      fVar142 = psVar70->fdy;
                                      fVar150 = fVar149;
                                      if (fVar149 < fVar144) {
                                        fVar158 = fVar102 - fVar143;
                                        fVar143 = (fVar102 - fVar148) + fVar115;
                                        fVar142 = -fVar142;
                                        fStack_318 = fVar147;
                                        fVar150 = fVar144;
                                        fVar148 = fVar158 + fVar115;
                                        fVar144 = fVar149;
                                      }
                                      iVar96 = (int)fVar150;
                                      iVar63 = (int)fVar144 + 1;
                                      fVar158 = ((float)iVar63 - fStack_318) * fVar142 + fVar102;
                                      fVar147 = psVar70->direction;
                                      fVar149 = (fVar158 - fVar143) * fVar147;
                                      lVar94 = (long)(int)fVar144;
                                      *(float *)((long)&scanline->data + lVar94 * 4) =
                                           (((fVar144 - (float)(int)fVar144) + 1.0) * -0.5 + 1.0) *
                                           fVar149 + *(float *)((long)&scanline->data + lVar94 * 4);
                                      if (iVar96 - iVar63 != 0 && iVar63 <= iVar96) {
                                        do {
                                          *(float *)((long)&scanline->data + lVar94 * 4 + 4) =
                                               fVar142 * fVar147 * 0.5 + fVar149 +
                                               *(float *)((long)&scanline->data + lVar94 * 4 + 4);
                                          fVar149 = fVar149 + fVar142 * fVar147;
                                          lVar94 = lVar94 + 1;
                                        } while (iVar96 + -1 != (int)lVar94);
                                      }
                                      lVar94 = (long)iVar96;
                                      *(float *)((long)&scanline->data + lVar94 * 4) =
                                           (fVar148 - (fVar142 * (float)(iVar96 - iVar63) + fVar158)
                                           ) * (((fVar150 - (float)iVar96) + 0.0) * -0.5 + 1.0) *
                                               fVar147 + fVar149 +
                                           *(float *)((long)&scanline->data + lVar94 * 4);
                                      fVar147 = (fVar148 - fVar143) * fVar147;
                                    }
                                    pfStack_348[lVar94] = fVar147 + pfStack_348[lVar94];
                                    goto LAB_0013922d;
                                  }
                                }
                                if ((uint)uStack_3f0 < 0x7fffffff) {
                                  uStack_314 = 0;
                                  uStack_310 = 0;
                                  uStack_30c = 0;
                                  fVar143 = fVar102;
                                  auStack_3e8 = ZEXT416((uint)fVar147);
                                  fStack_370 = fVar142;
                                  uVar62 = 0;
                                  do {
                                    fVar142 = (float)(int)uVar62;
                                    uVar98 = uVar62 + 1;
                                    fVar147 = (float)(int)uVar98;
                                    fVar141 = (fVar142 - fStack_318) / fStack_370 + fVar143;
                                    fVar144 = (fVar147 - fStack_318) / fStack_370 + fVar143;
                                    auStack_4b8._0_4_ = fVar141;
                                    auStack_478._0_4_ = fVar142;
                                    fVar148 = auStack_3e8._0_4_;
                                    fVar102 = fVar143;
                                    if ((fVar142 <= fStack_318) || (fVar148 <= fVar147)) {
                                      if ((fVar142 <= fVar148) || (fStack_318 <= fVar147)) {
                                        fVar149 = fStack_318;
                                        if (((fVar142 <= fStack_318) || (fVar148 <= fVar142)) &&
                                           ((fVar142 <= fVar148 || (fStack_318 <= fVar142)))) {
                                          if (((fStack_318 < fVar147) && (fVar147 < fVar148)) ||
                                             ((fVar142 = fStack_318, fVar141 = fVar143,
                                              fVar148 < fVar147 && (fVar147 < fStack_318)))) {
                                            auStack_458._0_4_ = fVar144;
                                            fVar142 = fStack_318;
                                            goto LAB_00138f12;
                                          }
                                          goto LAB_00138fc9;
                                        }
                                      }
                                      else {
                                        auStack_458._0_4_ = fVar144;
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar62,psVar70,fStack_318,
                                                   fVar143,fVar147,fVar144);
                                        fVar149 = fVar147;
                                        fVar142 = (float)auStack_478._0_4_;
                                        fVar143 = (float)auStack_458._0_4_;
                                      }
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar62,psVar70,fVar149,fVar143,
                                                 fVar142,fVar141);
                                      fVar142 = (float)auStack_478._0_4_;
                                    }
                                    else {
                                      auStack_458._0_4_ = fVar144;
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar62,psVar70,fStack_318,fVar143
                                                 ,fVar142,fVar141);
                                      fVar142 = (float)auStack_478._0_4_;
                                      fVar144 = (float)auStack_458._0_4_;
                                      fVar143 = fVar141;
LAB_00138f12:
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar62,psVar70,fVar142,fVar143,
                                                 fVar147,fVar144);
                                      fVar142 = fVar147;
                                      fVar141 = (float)auStack_458._0_4_;
                                    }
LAB_00138fc9:
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar62,psVar70,fVar142,fVar141,
                                               auStack_3e8._0_4_,fVar115);
                                    fVar143 = fVar102;
                                    fVar141 = fStack_318;
                                    uVar62 = uVar98;
                                  } while (uStack_3fc != uVar98);
                                }
                              }
                              else if (fStack_318 < fStack_400) {
                                if (0.0 <= fStack_318) {
                                  iVar63 = (int)fStack_318;
                                  uStack_314 = 0;
                                  uStack_310 = 0;
                                  uStack_30c = 0;
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,iVar63,psVar70,fStack_318,fVar102,
                                             fStack_318,fVar115);
                                  iVar63 = iVar63 + 1;
                                  fVar142 = fStack_318;
                                }
                                else {
                                  iVar63 = 0;
                                  fVar142 = fStack_318;
                                  fStack_318 = fVar141;
                                }
                                stbtt__handle_clipped_edge
                                          (pfStack_390,iVar63,psVar70,fVar142,fVar102,fVar142,
                                           fVar115);
                                fVar141 = fStack_318;
                              }
LAB_0013922d:
                              fStack_318 = fVar141;
                              ptr_00 = puStack_2c8;
                              iVar63 = iStack_378;
                              fVar141 = fStack_318;
                            }
                            psVar70 = (stbtt__active_edge *)auStack_488._0_8_;
                            if ((uint)uStack_3f0 < 0x7fffffff) {
                              fVar115 = 0.0;
                              psVar71 = scanline;
                              uVar65 = uStack_3a0;
                              lVar94 = lStack_2e0;
                              do {
                                fVar115 = fVar115 + *(float *)((long)&psVar71->data + lStack_2e0 * 4
                                                              );
                                iVar96 = (int)(ABS(*(float *)&psVar71->data + fVar115) * 255.0 + 0.5
                                              );
                                uVar86 = (uchar)iVar96;
                                if (0xfe < iVar96) {
                                  uVar86 = 0xff;
                                }
                                puStack_3a8[(int)uVar65] = uVar86;
                                uVar65 = (ulong)((int)uVar65 + 1);
                                psVar71 = (stbtt__buf *)((long)&psVar71->data + 4);
                                lVar94 = lVar94 + -1;
                              } while (lVar94 != 0);
                            }
                            for (; psVar70 != (stbtt__active_edge *)0x0; psVar70 = psVar70->next) {
                              psVar70->fx = psVar70->fdx + psVar70->fx;
                            }
                            iStack_378 = iVar63 + 1;
                            iVar96 = (int)uStack_398;
                            uStack_398 = (ulong)(iVar96 + 1);
                            uStack_3a0 = (ulong)(uint)((int)uStack_3a0 + iStack_37c);
                            pvVar67 = pvStack_3f8;
                            psVar88 = psStack_330;
                          } while (iVar96 != (int)uStack_3c8);
                        }
                        else {
                          ptr_00 = (undefined8 *)0x0;
                          pvVar67 = pvVar64;
                          iVar63 = iStack_378;
                          psVar88 = psStack_330;
                        }
                        while (iStack_378 = iVar63, psVar69 = psStack_330, pvVar64 = pvStack_3f8,
                              pvStack_3f8 = pvVar67, psStack_330 = psVar88,
                              ptr_00 != (undefined8 *)0x0) {
                          puVar72 = (undefined8 *)*ptr_00;
                          ImGui::MemFree(ptr_00);
                          ptr_00 = puVar72;
                          pvVar67 = pvStack_3f8;
                          iVar63 = iStack_378;
                          psVar88 = psStack_330;
                          psStack_330 = psVar69;
                          pvStack_3f8 = pvVar64;
                        }
                        if (scanline != asStack_288) {
                          ImGui::MemFree(scanline);
                        }
                        ImGui::MemFree(psVar69);
                      }
                      ImGui::MemFree(pvVar64);
                      ImGui::MemFree(psStack_3b0);
                    }
                  }
                }
                ImGui::MemFree((void *)CONCAT44(uStack_410._4_4_,(stbtt_uint32)uStack_410));
                auVar116 = _DAT_001695d0;
                if (1 < (byte)uStack_338) {
                  uVar54 = *(ushort *)(lStack_3b8 + 4);
                  asStack_288[0].data = (uchar *)0x0;
                  uVar62 = CONCAT22(0,*(ushort *)(lStack_3b8 + 6));
                  auStack_4b8._0_4_ = uVar62;
                  if (uVar62 != 0) {
                    puVar68 = puStack_3c0 +
                              (ulong)*(ushort *)(lStack_3b8 + 10) * lStack_460 +
                              (ulong)*(ushort *)(lStack_3b8 + 8);
                    iVar63 = (uint)uVar54 - (int)uStack_468;
                    uVar65 = (ulong)(iVar63 + 1);
                    uVar98 = 0;
                    do {
                      uVar87 = uStack_338;
                      memset(asStack_288,0,uStack_338);
                      auVar116 = _DAT_001695d0;
                      switch((int)uVar87) {
                      case 2:
                        if (iVar63 < 0) {
LAB_00139762:
                          uVar89 = 0;
                          uVar87 = 0;
                        }
                        else {
                          uVar89 = 0;
                          uVar87 = 0;
                          do {
                            bVar101 = puVar68[uVar89];
                            bVar109 = *(byte *)((long)&asStack_288[0].data +
                                               (ulong)((uint)uVar89 & 7));
                            *(byte *)((long)&asStack_288[0].data + (ulong)((uint)uVar89 + 2 & 7)) =
                                 bVar101;
                            uVar82 = (int)uVar87 + ((uint)bVar101 - (uint)bVar109);
                            uVar87 = (ulong)uVar82;
                            puVar68[uVar89] = (uchar)(uVar82 >> 1);
                            uVar89 = uVar89 + 1;
                          } while (uVar65 != uVar89);
                        }
                        break;
                      case 3:
                        if (iVar63 < 0) goto LAB_00139762;
                        uVar89 = 0;
                        uVar87 = 0;
                        do {
                          bVar101 = puVar68[uVar89];
                          bVar109 = *(byte *)((long)&asStack_288[0].data + (ulong)((uint)uVar89 & 7)
                                             );
                          *(byte *)((long)&asStack_288[0].data + (ulong)((uint)uVar89 + 3 & 7)) =
                               bVar101;
                          uVar87 = (ulong)((int)uVar87 + ((uint)bVar101 - (uint)bVar109));
                          puVar68[uVar89] = (uchar)(uVar87 / 3);
                          uVar89 = uVar89 + 1;
                        } while (uVar65 != uVar89);
                        break;
                      case 4:
                        if (iVar63 < 0) goto LAB_00139762;
                        uVar89 = 0;
                        uVar87 = 0;
                        do {
                          bVar101 = puVar68[uVar89];
                          uVar81 = (ulong)((uint)uVar89 & 7);
                          bVar109 = *(byte *)((long)&asStack_288[0].data + uVar81);
                          *(byte *)((long)&asStack_288[0].data + (uVar81 ^ 4)) = bVar101;
                          uVar82 = (int)uVar87 + ((uint)bVar101 - (uint)bVar109);
                          uVar87 = (ulong)uVar82;
                          puVar68[uVar89] = (uchar)(uVar82 >> 2);
                          uVar89 = uVar89 + 1;
                        } while (uVar65 != uVar89);
                        break;
                      case 5:
                        if (iVar63 < 0) goto LAB_00139762;
                        uVar89 = 0;
                        uVar87 = 0;
                        do {
                          bVar101 = puVar68[uVar89];
                          bVar109 = *(byte *)((long)&asStack_288[0].data + (ulong)((uint)uVar89 & 7)
                                             );
                          *(byte *)((long)&asStack_288[0].data + (ulong)((uint)uVar89 + 5 & 7)) =
                               bVar101;
                          uVar87 = (ulong)((int)uVar87 + ((uint)bVar101 - (uint)bVar109));
                          puVar68[uVar89] = (uchar)(uVar87 / 5);
                          uVar89 = uVar89 + 1;
                        } while (uVar65 != uVar89);
                        break;
                      default:
                        uVar89 = 0;
                        uVar87 = 0;
                        if (-1 < iVar63) {
                          do {
                            bVar101 = puVar68[uVar89];
                            bVar109 = *(byte *)((long)&asStack_288[0].data +
                                               (ulong)((uint)uVar89 & 7));
                            *(byte *)((long)&asStack_288[0].data +
                                     (ulong)((int)uStack_468 + (uint)uVar89 & 7)) = bVar101;
                            uVar87 = (ulong)((int)uVar87 + ((uint)bVar101 - (uint)bVar109));
                            puVar68[uVar89] = (uchar)(uVar87 / (uStack_468 & 0xffffffff));
                            uVar89 = uVar89 + 1;
                          } while (uVar65 != uVar89);
                        }
                      }
                      if ((int)uVar89 < (int)(uint)uVar54) {
                        uVar89 = uVar89 & 0xffffffff;
                        do {
                          uVar87 = (ulong)((int)uVar87 -
                                          (uint)*(byte *)((long)&asStack_288[0].data +
                                                         (ulong)((uint)uVar89 & 7)));
                          puVar68[uVar89] = (uchar)(uVar87 / (uStack_468 & 0xffffffff));
                          uVar89 = uVar89 + 1;
                        } while ((int)uVar89 < (int)(uint)uVar54);
                      }
                      puVar68 = puVar68 + lStack_460;
                      uVar98 = uVar98 + 1;
                    } while (uVar98 != uVar62);
                  }
                }
                if (1 < (byte)uStack_340) {
                  uVar54 = *(ushort *)(lStack_3b8 + 6);
                  asStack_288[0].data = (uchar *)0x0;
                  uVar62 = CONCAT22(0,*(ushort *)(lStack_3b8 + 4));
                  auStack_4b8._0_4_ = uVar62;
                  if (uVar62 != 0) {
                    pbVar85 = puStack_3c0 +
                              (ulong)*(ushort *)(lStack_3b8 + 10) * lStack_460 +
                              (ulong)*(ushort *)(lStack_3b8 + 8);
                    auStack_478._0_4_ = (uint)uVar54 - (int)uStack_3d8;
                    uVar65 = (ulong)((uint)uVar54 + (int)uStack_358 + 1);
                    uVar98 = 0;
                    do {
                      uVar87 = uStack_340;
                      memset(asStack_288,0,uStack_340);
                      auVar116 = _DAT_001695d0;
                      switch((int)uVar87) {
                      case 2:
                        if ((int)auStack_478._0_4_ < 0) {
LAB_00139a8c:
                          uVar89 = 0;
                          uVar87 = 0;
                        }
                        else {
                          uVar89 = 0;
                          uVar87 = 0;
                          pbVar90 = pbVar85;
                          do {
                            bVar101 = *pbVar90;
                            bVar109 = *(byte *)((long)&asStack_288[0].data +
                                               (ulong)((uint)uVar89 & 7));
                            *(byte *)((long)&asStack_288[0].data + (ulong)((uint)uVar89 + 2 & 7)) =
                                 bVar101;
                            uVar82 = (int)uVar87 + ((uint)bVar101 - (uint)bVar109);
                            uVar87 = (ulong)uVar82;
                            *pbVar90 = (byte)(uVar82 >> 1);
                            uVar89 = uVar89 + 1;
                            pbVar90 = pbVar90 + lStack_460;
                          } while (uVar65 != uVar89);
                        }
                        break;
                      case 3:
                        if ((int)auStack_478._0_4_ < 0) goto LAB_00139a8c;
                        uVar89 = 0;
                        uVar87 = 0;
                        pbVar90 = pbVar85;
                        do {
                          bVar101 = *pbVar90;
                          bVar109 = *(byte *)((long)&asStack_288[0].data + (ulong)((uint)uVar89 & 7)
                                             );
                          *(byte *)((long)&asStack_288[0].data + (ulong)((uint)uVar89 + 3 & 7)) =
                               bVar101;
                          uVar87 = (ulong)((int)uVar87 + ((uint)bVar101 - (uint)bVar109));
                          *pbVar90 = (byte)(uVar87 / 3);
                          uVar89 = uVar89 + 1;
                          pbVar90 = pbVar90 + lStack_460;
                        } while (uVar65 != uVar89);
                        break;
                      case 4:
                        if ((int)auStack_478._0_4_ < 0) goto LAB_00139a8c;
                        uVar89 = 0;
                        uVar87 = 0;
                        pbVar90 = pbVar85;
                        do {
                          bVar101 = *pbVar90;
                          uVar81 = (ulong)((uint)uVar89 & 7);
                          bVar109 = *(byte *)((long)&asStack_288[0].data + uVar81);
                          *(byte *)((long)&asStack_288[0].data + (uVar81 ^ 4)) = bVar101;
                          uVar82 = (int)uVar87 + ((uint)bVar101 - (uint)bVar109);
                          uVar87 = (ulong)uVar82;
                          *pbVar90 = (byte)(uVar82 >> 2);
                          uVar89 = uVar89 + 1;
                          pbVar90 = pbVar90 + lStack_460;
                        } while (uVar65 != uVar89);
                        break;
                      case 5:
                        if ((int)auStack_478._0_4_ < 0) goto LAB_00139a8c;
                        uVar89 = 0;
                        uVar87 = 0;
                        pbVar90 = pbVar85;
                        do {
                          bVar101 = *pbVar90;
                          bVar109 = *(byte *)((long)&asStack_288[0].data + (ulong)((uint)uVar89 & 7)
                                             );
                          *(byte *)((long)&asStack_288[0].data + (ulong)((uint)uVar89 + 5 & 7)) =
                               bVar101;
                          uVar87 = (ulong)((int)uVar87 + ((uint)bVar101 - (uint)bVar109));
                          *pbVar90 = (byte)(uVar87 / 5);
                          uVar89 = uVar89 + 1;
                          pbVar90 = pbVar90 + lStack_460;
                        } while (uVar65 != uVar89);
                        break;
                      default:
                        if ((int)auStack_478._0_4_ < 0) {
                          uVar89 = 0;
                          uVar87 = 0;
                        }
                        else {
                          uVar89 = 0;
                          uVar87 = 0;
                          pbVar90 = pbVar85;
                          do {
                            bVar101 = *pbVar90;
                            bVar109 = *(byte *)((long)&asStack_288[0].data +
                                               (ulong)((uint)uVar89 & 7));
                            *(byte *)((long)&asStack_288[0].data +
                                     (ulong)((int)uStack_3d8 + (uint)uVar89 & 7)) = bVar101;
                            uVar87 = (ulong)((int)uVar87 + ((uint)bVar101 - (uint)bVar109));
                            *pbVar90 = (byte)(uVar87 / (uStack_3d8 & 0xffffffff));
                            uVar89 = uVar89 + 1;
                            pbVar90 = pbVar90 + lStack_460;
                          } while (uVar65 != uVar89);
                        }
                      }
                      if ((int)uVar89 < (int)(uint)uVar54) {
                        uVar89 = (ulong)(int)uVar89;
                        pbVar90 = pbVar85 + lStack_460 * uVar89;
                        do {
                          uVar87 = (ulong)((int)uVar87 -
                                          (uint)*(byte *)((long)&asStack_288[0].data +
                                                         (ulong)((uint)uVar89 & 7)));
                          *pbVar90 = (byte)(uVar87 / (uStack_3d8 & 0xffffffff));
                          uVar89 = uVar89 + 1;
                          pbVar90 = pbVar90 + lStack_460;
                        } while (uVar54 != uVar89);
                      }
                      pbVar85 = pbVar85 + 1;
                      uVar98 = uVar98 + 1;
                    } while (uVar98 != uVar62);
                  }
                }
                puStack_2f0[4] =
                     (float)(int)(short)((short)(uStack_380 << 8) + (short)uStack_384) * fStack_328;
                *(ulong *)(puStack_2f0 + 2) =
                     CONCAT44((float)iStack_36c * (float)auStack_58._4_4_ + (float)auStack_48._4_4_,
                              (float)iStack_368 * (float)auStack_58._0_4_ + (float)auStack_48._0_4_)
                ;
                uVar151 = *(undefined4 *)(lStack_3b8 + 8);
                *puStack_2f0 = uVar151;
                uVar62 = *(uint *)(lStack_3b8 + 4);
                uVar54 = (ushort)(uVar62 >> 0x10);
                puStack_2f0[1] =
                     CONCAT22((short)((uint)uVar151 >> 0x10) + uVar54,(short)uVar151 + (short)uVar62
                             );
                puStack_2f0[5] =
                     (float)(int)((uVar62 & 0xffff) + iStack_368) * (float)auStack_58._0_4_ +
                     (float)auStack_48._0_4_;
                puStack_2f0[6] =
                     (float)(int)((uint)uVar54 + iStack_36c) * (float)auStack_58._4_4_ +
                     (float)auStack_48._4_4_;
                lVar94 = lStack_2f8;
                lVar74 = lStack_2e8;
                psVar83 = psStack_350;
                auVar118 = _DAT_00166f00;
              }
            }
            lVar74 = lVar74 + 1;
            uVar62 = in_stack_fffffffffffffb64;
          } while (lVar74 < psVar83[1].fontstart);
        }
        fVar115 = pIStack_308[lStack_300].RasterizerMultiply;
        _auStack_4b8 = ZEXT416((uint)fVar115);
        if ((fVar115 != 1.0) || (NAN(fVar115))) {
          auStack_4b8._4_4_ = fVar115;
          auStack_4b8._0_4_ = fVar115;
          fStack_4b0 = fVar115;
          fStack_4ac = fVar115;
          lVar94 = 0;
          uVar62 = 0;
          uVar98 = 1;
          uVar82 = 2;
          uVar124 = 3;
          uVar125 = 4;
          uVar127 = 5;
          uVar128 = 6;
          uVar129 = 7;
          uVar130 = 8;
          uVar131 = 9;
          uVar132 = 10;
          uVar133 = 0xb;
          uVar134 = 0xc;
          uVar136 = 0xd;
          uVar137 = 0xe;
          uVar138 = 0xf;
          do {
            fVar161 = (((float)(uVar130 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar130 & 0xffff | 0x4b000000)) * fVar115;
            fVar166 = (((float)(uVar131 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar131 & 0xffff | 0x4b000000)) * fVar115;
            fVar167 = (((float)(uVar132 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar132 & 0xffff | 0x4b000000)) * fVar115;
            fVar168 = (((float)(uVar133 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar133 & 0xffff | 0x4b000000)) * fVar115;
            fVar150 = (((float)(uVar134 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar134 & 0xffff | 0x4b000000)) * fVar115;
            fVar158 = (((float)(uVar136 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar136 & 0xffff | 0x4b000000)) * fVar115;
            fVar159 = (((float)(uVar137 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar137 & 0xffff | 0x4b000000)) * fVar115;
            fVar160 = (((float)(uVar138 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar138 & 0xffff | 0x4b000000)) * fVar115;
            fVar144 = (((float)(uVar62 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar62 & 0xffff | 0x4b000000)) * fVar115;
            fVar147 = (((float)(uVar98 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar98 & 0xffff | 0x4b000000)) * fVar115;
            fVar148 = (((float)(uVar82 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar82 & 0xffff | 0x4b000000)) * fVar115;
            fVar149 = (((float)(uVar124 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar124 & 0xffff | 0x4b000000)) * fVar115;
            fVar102 = (((float)(uVar125 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar125 & 0xffff | 0x4b000000)) * fVar115;
            fVar141 = (((float)(uVar127 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar127 & 0xffff | 0x4b000000)) * fVar115;
            fVar142 = (((float)(uVar128 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar128 & 0xffff | 0x4b000000)) * fVar115;
            fVar143 = (((float)(uVar129 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar129 & 0xffff | 0x4b000000)) * fVar115;
            auVar140._0_4_ = (int)fVar102;
            auVar140._4_4_ = (int)fVar141;
            auVar140._8_4_ = (int)fVar142;
            auVar140._12_4_ = (int)fVar143;
            auVar179._0_4_ = auVar140._0_4_ >> 0x1f;
            auVar179._4_4_ = auVar140._4_4_ >> 0x1f;
            auVar179._8_4_ = auVar140._8_4_ >> 0x1f;
            auVar179._12_4_ = auVar140._12_4_ >> 0x1f;
            auVar139._0_4_ = (int)(fVar102 - 2.1474836e+09);
            auVar139._4_4_ = (int)(fVar141 - 2.1474836e+09);
            auVar139._8_4_ = (int)(fVar142 - 2.1474836e+09);
            auVar139._12_4_ = (int)(fVar143 - 2.1474836e+09);
            auVar140 = auVar139 & auVar179 | auVar140;
            auVar146._0_4_ = (int)fVar144;
            auVar146._4_4_ = (int)fVar147;
            auVar146._8_4_ = (int)fVar148;
            auVar146._12_4_ = (int)fVar149;
            auVar180._0_4_ = auVar146._0_4_ >> 0x1f;
            auVar180._4_4_ = auVar146._4_4_ >> 0x1f;
            auVar180._8_4_ = auVar146._8_4_ >> 0x1f;
            auVar180._12_4_ = auVar146._12_4_ >> 0x1f;
            auVar145._0_4_ = (int)(fVar144 - 2.1474836e+09);
            auVar145._4_4_ = (int)(fVar147 - 2.1474836e+09);
            auVar145._8_4_ = (int)(fVar148 - 2.1474836e+09);
            auVar145._12_4_ = (int)(fVar149 - 2.1474836e+09);
            auVar146 = auVar145 & auVar180 | auVar146;
            auVar175._0_4_ = (int)fVar150;
            auVar175._4_4_ = (int)fVar158;
            auVar175._8_4_ = (int)fVar159;
            auVar175._12_4_ = (int)fVar160;
            auVar183._0_4_ = auVar175._0_4_ >> 0x1f;
            auVar183._4_4_ = auVar175._4_4_ >> 0x1f;
            auVar183._8_4_ = auVar175._8_4_ >> 0x1f;
            auVar183._12_4_ = auVar175._12_4_ >> 0x1f;
            auVar174._0_4_ = (int)(fVar150 - 2.1474836e+09);
            auVar174._4_4_ = (int)(fVar158 - 2.1474836e+09);
            auVar174._8_4_ = (int)(fVar159 - 2.1474836e+09);
            auVar174._12_4_ = (int)(fVar160 - 2.1474836e+09);
            auVar175 = auVar174 & auVar183 | auVar175;
            auVar163._0_4_ = (int)fVar161;
            auVar163._4_4_ = (int)fVar166;
            auVar163._8_4_ = (int)fVar167;
            auVar163._12_4_ = (int)fVar168;
            auVar181._0_4_ = auVar163._0_4_ >> 0x1f;
            auVar181._4_4_ = auVar163._4_4_ >> 0x1f;
            auVar181._8_4_ = auVar163._8_4_ >> 0x1f;
            auVar181._12_4_ = auVar163._12_4_ >> 0x1f;
            auVar162._0_4_ = (int)(fVar161 - 2.1474836e+09);
            auVar162._4_4_ = (int)(fVar166 - 2.1474836e+09);
            auVar162._8_4_ = (int)(fVar167 - 2.1474836e+09);
            auVar162._12_4_ = (int)(fVar168 - 2.1474836e+09);
            auVar163 = auVar162 & auVar181 | auVar163;
            auVar118 = auVar163 ^ _DAT_00166f00;
            auVar156._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
            auVar156._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
            auVar156._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
            auVar156._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
            auVar118 = ~auVar156 & auVar116 | auVar163 & auVar156;
            auVar164 = auVar175 ^ _DAT_00166f00;
            auVar182._0_4_ = -(uint)(auVar164._0_4_ < -0x7fffff01);
            auVar182._4_4_ = -(uint)(auVar164._4_4_ < -0x7fffff01);
            auVar182._8_4_ = -(uint)(auVar164._8_4_ < -0x7fffff01);
            auVar182._12_4_ = -(uint)(auVar164._12_4_ < -0x7fffff01);
            auVar164 = ~auVar182 & auVar116 | auVar175 & auVar182;
            sVar13 = auVar118._0_2_;
            cVar19 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[0] - (0xff < sVar13);
            sVar13 = auVar118._2_2_;
            sVar55 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar118[2] - (0xff < sVar13),cVar19
                             );
            sVar13 = auVar118._4_2_;
            cVar110 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[4] - (0xff < sVar13);
            sVar13 = auVar118._6_2_;
            uVar151 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar118[6] - (0xff < sVar13),
                               CONCAT12(cVar110,sVar55));
            sVar13 = auVar118._8_2_;
            cVar20 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[8] - (0xff < sVar13);
            sVar13 = auVar118._10_2_;
            uVar152 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar118[10] - (0xff < sVar13),
                               CONCAT14(cVar20,uVar151));
            sVar13 = auVar118._12_2_;
            cVar21 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[0xc] - (0xff < sVar13);
            sVar13 = auVar118._14_2_;
            uVar153 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar118[0xe] - (0xff < sVar13),
                               CONCAT16(cVar21,uVar152));
            sVar13 = auVar164._0_2_;
            cVar22 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[0] - (0xff < sVar13);
            sVar13 = auVar164._2_2_;
            auVar154._0_10_ =
                 CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar164[2] - (0xff < sVar13),
                          CONCAT18(cVar22,uVar153));
            sVar13 = auVar164._4_2_;
            cVar23 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[4] - (0xff < sVar13);
            auVar154[10] = cVar23;
            sVar13 = auVar164._6_2_;
            auVar154[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar164[6] - (0xff < sVar13);
            sVar13 = auVar164._8_2_;
            cVar24 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[8] - (0xff < sVar13);
            auVar155[0xc] = cVar24;
            auVar155._0_12_ = auVar154;
            sVar13 = auVar164._10_2_;
            auVar155[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar164[10] - (0xff < sVar13);
            sVar13 = auVar164._12_2_;
            cVar111 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[0xc] - (0xff < sVar13);
            auVar157[0xe] = cVar111;
            auVar157._0_14_ = auVar155;
            sVar13 = auVar164._14_2_;
            auVar157[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar164[0xe] - (0xff < sVar13);
            auVar118 = auVar146 ^ _DAT_00166f00;
            auVar176._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
            auVar176._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
            auVar176._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
            auVar176._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
            auVar164 = ~auVar176 & auVar116 | auVar146 & auVar176;
            auVar118 = auVar140 ^ _DAT_00166f00;
            auVar165._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
            auVar165._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
            auVar165._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
            auVar165._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
            auVar118 = ~auVar165 & auVar116 | auVar140 & auVar165;
            sVar13 = auVar164._0_2_;
            cVar25 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[0] - (0xff < sVar13);
            sVar13 = auVar164._2_2_;
            sVar112 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar164[2] - (0xff < sVar13),
                               cVar25);
            sVar13 = auVar164._4_2_;
            cVar26 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[4] - (0xff < sVar13);
            sVar13 = auVar164._6_2_;
            uVar169 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar164[6] - (0xff < sVar13),
                               CONCAT12(cVar26,sVar112));
            sVar13 = auVar164._8_2_;
            cVar27 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[8] - (0xff < sVar13);
            sVar13 = auVar164._10_2_;
            uVar170 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar164[10] - (0xff < sVar13),
                               CONCAT14(cVar27,uVar169));
            sVar13 = auVar164._12_2_;
            cVar28 = (0 < sVar13) * (sVar13 < 0x100) * auVar164[0xc] - (0xff < sVar13);
            sVar13 = auVar164._14_2_;
            uVar171 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar164[0xe] - (0xff < sVar13),
                               CONCAT16(cVar28,uVar170));
            sVar13 = auVar118._0_2_;
            cVar29 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[0] - (0xff < sVar13);
            sVar13 = auVar118._2_2_;
            auVar172._0_10_ =
                 CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar118[2] - (0xff < sVar13),
                          CONCAT18(cVar29,uVar171));
            sVar13 = auVar118._4_2_;
            cVar30 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[4] - (0xff < sVar13);
            auVar172[10] = cVar30;
            sVar13 = auVar118._6_2_;
            auVar172[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar118[6] - (0xff < sVar13);
            sVar13 = auVar118._8_2_;
            cVar31 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[8] - (0xff < sVar13);
            auVar173[0xc] = cVar31;
            auVar173._0_12_ = auVar172;
            sVar13 = auVar118._10_2_;
            auVar173[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar118[10] - (0xff < sVar13);
            sVar13 = auVar118._12_2_;
            cVar32 = (0 < sVar13) * (sVar13 < 0x100) * auVar118[0xc] - (0xff < sVar13);
            auVar177[0xe] = cVar32;
            auVar177._0_14_ = auVar173;
            sVar13 = auVar118._14_2_;
            auVar177[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar118[0xe] - (0xff < sVar13);
            sVar13 = (short)((uint)uVar169 >> 0x10);
            auVar178[1] = (0 < sVar13) * (sVar13 < 0x100) * cVar26 - (0xff < sVar13);
            auVar178[0] = (0 < sVar112) * (sVar112 < 0x100) * cVar25 - (0xff < sVar112);
            sVar13 = (short)((uint6)uVar170 >> 0x20);
            auVar178[2] = (0 < sVar13) * (sVar13 < 0x100) * cVar27 - (0xff < sVar13);
            sVar13 = (short)((ulong)uVar171 >> 0x30);
            auVar178[3] = (0 < sVar13) * (sVar13 < 0x100) * cVar28 - (0xff < sVar13);
            sVar13 = (short)((unkuint10)auVar172._0_10_ >> 0x40);
            auVar178[4] = (0 < sVar13) * (sVar13 < 0x100) * cVar29 - (0xff < sVar13);
            sVar13 = auVar172._10_2_;
            auVar178[5] = (0 < sVar13) * (sVar13 < 0x100) * cVar30 - (0xff < sVar13);
            sVar13 = auVar173._12_2_;
            auVar178[6] = (0 < sVar13) * (sVar13 < 0x100) * cVar31 - (0xff < sVar13);
            sVar13 = auVar177._14_2_;
            auVar178[7] = (0 < sVar13) * (sVar13 < 0x100) * cVar32 - (0xff < sVar13);
            auVar178[8] = (0 < sVar55) * (sVar55 < 0x100) * cVar19 - (0xff < sVar55);
            sVar13 = (short)((uint)uVar151 >> 0x10);
            auVar178[9] = (0 < sVar13) * (sVar13 < 0x100) * cVar110 - (0xff < sVar13);
            sVar13 = (short)((uint6)uVar152 >> 0x20);
            auVar178[10] = (0 < sVar13) * (sVar13 < 0x100) * cVar20 - (0xff < sVar13);
            sVar13 = (short)((ulong)uVar153 >> 0x30);
            auVar178[0xb] = (0 < sVar13) * (sVar13 < 0x100) * cVar21 - (0xff < sVar13);
            sVar13 = (short)((unkuint10)auVar154._0_10_ >> 0x40);
            auVar178[0xc] = (0 < sVar13) * (sVar13 < 0x100) * cVar22 - (0xff < sVar13);
            sVar13 = auVar154._10_2_;
            auVar178[0xd] = (0 < sVar13) * (sVar13 < 0x100) * cVar23 - (0xff < sVar13);
            sVar13 = auVar155._12_2_;
            auVar178[0xe] = (0 < sVar13) * (sVar13 < 0x100) * cVar24 - (0xff < sVar13);
            sVar13 = auVar157._14_2_;
            auVar178[0xf] = (0 < sVar13) * (sVar13 < 0x100) * cVar111 - (0xff < sVar13);
            *(undefined1 (*) [16])((long)&asStack_288[0].data + lVar94) = auVar178;
            lVar94 = lVar94 + 0x10;
            uVar62 = uVar62 + 0x10;
            uVar98 = uVar98 + 0x10;
            uVar82 = uVar82 + 0x10;
            uVar124 = uVar124 + 0x10;
            uVar125 = uVar125 + 0x10;
            uVar127 = uVar127 + 0x10;
            uVar128 = uVar128 + 0x10;
            uVar129 = uVar129 + 0x10;
            uVar130 = uVar130 + 0x10;
            uVar131 = uVar131 + 0x10;
            uVar132 = uVar132 + 0x10;
            uVar133 = uVar133 + 0x10;
            uVar134 = uVar134 + 0x10;
            uVar136 = uVar136 + 0x10;
            uVar137 = uVar137 + 0x10;
            uVar138 = uVar138 + 0x10;
          } while (lVar94 != 0x100);
          auVar118 = _DAT_00166f00;
          if (0 < psVar83[1].cff.cursor) {
            lVar74._0_4_ = psVar83[1].hmtx;
            lVar74._4_4_ = psVar83[1].kern;
            iVar63 = 0;
            do {
              if ((*(int *)(lVar74 + 0xc) != 0) && (*(ushort *)(lVar74 + 6) != 0)) {
                uVar54 = *(ushort *)(lVar74 + 4);
                iVar96 = atlas->TexWidth;
                puVar68 = atlas->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar74 + 10) * (long)iVar96 +
                          (ulong)*(ushort *)(lVar74 + 8);
                uVar62 = (uint)*(ushort *)(lVar74 + 6);
                do {
                  if ((ulong)uVar54 != 0) {
                    uVar65 = 0;
                    do {
                      puVar68[uVar65] =
                           *(uchar *)((long)&asStack_288[0].data + (ulong)puVar68[uVar65]);
                      uVar65 = uVar65 + 1;
                    } while (uVar54 != uVar65);
                  }
                  puVar68 = puVar68 + iVar96;
                  bVar53 = 1 < (int)uVar62;
                  uVar62 = uVar62 - 1;
                } while (bVar53);
              }
              iVar63 = iVar63 + 1;
              lVar74 = lVar74 + 0x10;
            } while (iVar63 < psVar83[1].cff.cursor);
          }
        }
        psVar83[1].hmtx = 0;
        psVar83[1].kern = 0;
        lVar94 = lStack_300;
        pIVar84 = atlas;
      }
      lVar94 = lVar94 + 1;
    } while (lVar94 < iVar14);
  }
  ImGui::MemFree(psStack_418);
  ImGui::MemFree(psStack_360);
  uVar153 = auStack_448._8_8_;
  if ((void *)auStack_448._8_8_ != (void *)0x0) {
    auVar39._8_8_ = 0;
    auVar39._0_8_ = auStack_448._8_8_;
    auStack_448 = auVar39 << 0x40;
    ImGui::MemFree((void *)uVar153);
    auStack_448._8_8_ = 0;
  }
  if (0 < iVar14) {
    lVar94 = 0;
    auVar108._0_12_ = DAT_001695f0._0_12_;
    auVar108._12_2_ = DAT_001695f0._6_2_;
    auVar108._14_2_ = DAT_001695f0._6_2_;
    auVar107._12_4_ = auVar108._12_4_;
    auVar107._0_10_ = (unkbyte10)DAT_001695f0;
    auVar107._10_2_ = DAT_001695f0._4_2_;
    auVar106._10_6_ = auVar107._10_6_;
    auVar106._0_8_ = (undefined8)DAT_001695f0;
    auVar106._8_2_ = DAT_001695f0._4_2_;
    auStack_458._8_8_ = auVar106._8_8_;
    auStack_458._6_2_ = DAT_001695f0._2_2_;
    auStack_458._4_2_ = DAT_001695f0._2_2_;
    auStack_458._0_2_ = (undefined2)DAT_001695f0;
    auStack_458._2_2_ = auStack_458._0_2_;
    do {
      auVar116 = auStack_478;
      lVar74 = lVar94 * 0x110;
      if (*(int *)((long)pvStack_490 + lVar74 + 0xe8) != 0) {
        pIVar17 = (pIVar84->ConfigData).Data;
        pIVar91 = pIVar17 + lVar94;
        pIVar15 = pIVar17[lVar94].DstFont;
        if (pIVar17[lVar94].MergeMode == false) {
          fVar115 = pIVar17[lVar94].SizePixels;
          lVar99 = *(long *)((long)pvStack_490 + lVar74 + 8);
          lVar80 = (long)*(int *)((long)pvStack_490 + lVar74 + 0x24);
          auStack_478._1_3_ = 0;
          auStack_478[0] = *(byte *)(lVar99 + 4 + lVar80);
          auStack_478._4_12_ = auVar116._4_12_;
          bVar101 = *(byte *)(lVar99 + 5 + lVar80);
          bVar109 = *(byte *)(lVar99 + 7 + lVar80);
          bVar11 = *(byte *)(lVar99 + 6 + lVar80);
          ImFont::ClearOutputData(pIVar15);
          iVar63 = (uint)bVar11 * 0x100 + auStack_478._0_4_;
          auVar34._1_9_ = (unkuint9)(byte)((uint)iVar63 >> 0x18) << 8;
          auVar34[0] = (char)((uint)iVar63 >> 0x10);
          auVar34._10_6_ = 0;
          auVar43._1_12_ = SUB1612(auVar34 << 0x28,4);
          auVar43[0] = (char)((uint)iVar63 >> 8);
          auVar43[0xd] = 0;
          auVar46._1_14_ = auVar43 << 8;
          auVar46[0] = (char)iVar63;
          auVar46[0xf] = 0;
          auVar116 = ZEXT416((uint)bVar101 | (uint)bVar109 << 0x10) | auVar46 << 8;
          sVar55 = auVar116._0_2_;
          sVar13 = auVar116._2_2_;
          auVar119._0_4_ = (float)((int)sVar55 - (int)sVar13);
          fVar115 = fVar115 / auVar119._0_4_;
          sVar114 = auVar116._6_2_;
          auVar122._0_14_ = ZEXT414((uint)auVar119._0_4_);
          auVar122._14_2_ = sVar114;
          sVar112 = auVar116._4_2_;
          auVar121._12_4_ = auVar122._12_4_;
          auVar121._4_6_ = 0;
          auVar121._0_4_ = auVar119._0_4_;
          auVar121._10_2_ = sVar112;
          auVar120._10_6_ = auVar121._10_6_;
          auVar120._4_6_ = 0;
          auVar120._0_4_ = auVar119._0_4_;
          auVar119._8_8_ = auVar120._8_8_;
          auVar119._6_2_ = sVar13;
          auVar119._4_2_ = (short)((uint)auVar119._0_4_ >> 0x10);
          auVar126._0_2_ = -(ushort)(sVar55 < (short)auStack_458._0_2_);
          auVar126._2_2_ = -(ushort)(sVar55 < (short)auStack_458._2_2_);
          auVar126._4_2_ = -(ushort)(sVar13 < (short)auStack_458._4_2_);
          auVar126._6_2_ = -(ushort)(sVar13 < (short)auStack_458._6_2_);
          auVar126._8_2_ = -(ushort)(sVar112 < (short)auStack_458._8_2_);
          auVar126._10_2_ = -(ushort)(sVar112 < (short)auStack_458._10_2_);
          auVar126._12_2_ = -(ushort)(sVar114 < (short)auStack_458._12_2_);
          auVar126._14_2_ = -(ushort)(sVar114 < (short)auStack_458._14_2_);
          auVar116 = auVar126 & _DAT_00166cd0 | ~auVar126 & _DAT_00166f40;
          pIVar15->FontSize = pIVar91->SizePixels;
          pIVar15->ConfigData = pIVar91;
          pIVar15->ConfigDataCount = 0;
          pIVar15->ContainerAtlas = pIVar84;
          pIVar15->Ascent = (float)(int)(fVar115 * (float)(int)sVar55 + auVar116._0_4_);
          pIVar15->Descent =
               (float)(int)(fVar115 * (float)(auVar119._4_4_ >> 0x10) + auVar116._4_4_);
        }
        pIVar15->ConfigDataCount = pIVar15->ConfigDataCount + 1;
        if (0 < *(int *)((long)pvStack_490 + lVar74 + 0xe8)) {
          fVar115 = (pIVar91->GlyphOffset).x;
          auStack_478 = ZEXT416((uint)((float)(int)(pIVar15->Ascent + 0.5) +
                                      (pIVar91->GlyphOffset).y));
          lVar80 = 0;
          lVar99 = 0;
          do {
            lVar18 = *(long *)((long)pvStack_490 + lVar74 + 0xd0);
            fVar141 = 1.0 / (float)pIVar84->TexHeight;
            fVar102 = 1.0 / (float)pIVar84->TexWidth;
            ImFont::AddGlyph(pIVar15,pIVar91,
                             *(ImWchar *)
                              (*(long *)((long)pvStack_490 + lVar74 + 0x108) + lVar99 * 4),
                             *(float *)(lVar18 + 8 + lVar80) + 0.0 + fVar115,
                             *(float *)(lVar18 + 0xc + lVar80) + 0.0 + auStack_478._0_4_,
                             *(float *)(lVar18 + 0x14 + lVar80) + 0.0 + fVar115,
                             *(float *)(lVar18 + 0x18 + lVar80) + 0.0 + auStack_478._0_4_,
                             (float)*(ushort *)(lVar18 + lVar80) * fVar102,
                             (float)*(ushort *)(lVar18 + 2 + lVar80) * fVar141,
                             (float)*(ushort *)(lVar18 + 4 + lVar80) * fVar102,
                             (float)*(ushort *)(lVar18 + 6 + lVar80) * fVar141,
                             *(float *)(lVar18 + 0x10 + lVar80));
            lVar99 = lVar99 + 1;
            lVar80 = lVar80 + 0x1c;
          } while (lVar99 < *(int *)((long)pvStack_490 + lVar74 + 0xe8));
        }
      }
      lVar94 = lVar94 + 1;
    } while (lVar94 < iVar14);
  }
  if (0 < iVar14) {
    lVar94 = 0x108;
    lVar74 = 0;
    do {
      if (*(void **)((long)pvStack_490 + lVar94) != (void *)0x0) {
        ImGui::MemFree(*(void **)((long)pvStack_490 + lVar94));
      }
      pvVar64 = *(void **)((long)pvStack_490 + lVar94 + -0x10);
      if (pvVar64 != (void *)0x0) {
        ImGui::MemFree(pvVar64);
      }
      lVar74 = lVar74 + 1;
      lVar94 = lVar94 + 0x110;
    } while (lVar74 < iVar14);
  }
  ImFontAtlasBuildFinish(pIVar84);
  if (pvStack_420 != (void *)0x0) {
    ImGui::MemFree(pvStack_420);
  }
  if ((void *)auStack_448._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)auStack_448._8_8_);
  }
LAB_0013a313:
  bVar101 = (byte)((uint)iVar185 >> 0x18);
  if (pvStack_430 != (void *)0x0) {
    ImGui::MemFree(pvStack_430);
  }
  if (pvStack_490 != (void *)0x0) {
    ImGui::MemFree(pvStack_490);
  }
  return (bool)(bVar101 & 1);
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");

    // Select builder
    // - Note that we do not reassign to atlas->FontBuilderIO, since it is likely to point to static data which
    //   may mess with some hot-reloading schemes. If you need to assign to this (for dynamic selection) AND are
    //   using a hot-reloading scheme that messes up static data, store your own instance of ImFontBuilderIO somewhere
    //   and point to it instead of pointing directly to return value of the GetBuilderXXX functions.
    const ImFontBuilderIO* builder_io = FontBuilderIO;
    if (builder_io == NULL)
    {
#ifdef IMGUI_ENABLE_FREETYPE
        builder_io = ImGuiFreeType::GetBuilderForFreeType();
#elif defined(IMGUI_ENABLE_STB_TRUETYPE)
        builder_io = ImFontAtlasGetBuilderForStbTruetype();
#else
        IM_ASSERT(0); // Invalid Build function
#endif
    }

    // Build
    return builder_io->FontBuilder_Build(this);
}